

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O2

void anon_unknown.dwarf_112c3b::testDct(void)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iter_1;
  int iVar105;
  ostream *poVar106;
  __m128 *srcVec;
  undefined1 (*pauVar107) [16];
  int col;
  long lVar108;
  undefined8 *puVar109;
  float *pfVar110;
  int iter;
  int iVar111;
  int i;
  long lVar112;
  ulong uVar113;
  int iter_19;
  byte bVar114;
  float fVar115;
  float fVar173;
  float fVar175;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  double dVar116;
  float fVar174;
  undefined1 in_ZMM0 [64];
  undefined1 auVar141 [64];
  undefined1 extraout_var_23 [48];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  float fVar176;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar211;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar228;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar240;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar258;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar266;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 in_ZMM7 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar285 [48];
  undefined1 auVar286 [36];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  float fVar287;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar314;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar334;
  float fVar335;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar336 [32];
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar384;
  undefined1 auVar370 [32];
  float fVar385;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar386;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  SimdAlignedBuffer64f test;
  SimdAlignedBuffer64f orig;
  Rand48 rand48;
  __m128 in [8];
  CpuId cpuid;
  SimdAlignedBuffer64<float> local_108;
  SimdAlignedBuffer64<float> local_f8;
  ushort local_e6 [3];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  CpuId local_5f [6];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  
  bVar114 = 0;
  local_e6[0] = 0x5a5a;
  local_e6[1] = 0x5a5a;
  local_e6[2] = 0x5a5a;
  Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64(&local_f8);
  Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64(&local_108);
  poVar106 = std::operator<<((ostream *)&std::cout,"   DCT Round Trip ");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      auVar141._0_8_ = (double)Imath_2_5::erand48(local_e6);
      auVar141._8_56_ = extraout_var;
      in_ZMM0._4_60_ = auVar141._4_60_;
      in_ZMM0._0_4_ = (float)auVar141._0_8_;
      *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[lVar112] = in_ZMM0._0_4_;
    }
    for (iVar105 = 0; iVar105 != 2; iVar105 = iVar105 + 1) {
      lVar112 = 0xe0;
      while( true ) {
        if (lVar112 == 0x100) break;
        pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
        pfVar6 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xe0) + lVar112);
        pfVar7 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xc0) + lVar112);
        pfVar8 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xa0) + lVar112);
        pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x80) + lVar112);
        fVar240 = *pfVar6 + *pfVar110;
        fVar255 = pfVar6[1] + pfVar110[1];
        fVar256 = pfVar6[2] + pfVar110[2];
        fVar257 = pfVar6[3] + pfVar110[3];
        fVar115 = *pfVar7 + *pfVar8;
        fVar173 = pfVar7[1] + pfVar8[1];
        fVar174 = pfVar7[2] + pfVar8[2];
        fVar175 = pfVar7[3] + pfVar8[3];
        pfVar3 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x60) + lVar112);
        fVar266 = *pfVar2 + *pfVar3;
        fVar282 = pfVar2[1] + pfVar3[1];
        fVar283 = pfVar2[2] + pfVar3[2];
        fVar284 = pfVar2[3] + pfVar3[3];
        pfVar4 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x40) + lVar112);
        pfVar5 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x20) + lVar112);
        fVar199 = *pfVar6 - *pfVar110;
        fVar208 = pfVar6[1] - pfVar110[1];
        fVar209 = pfVar6[2] - pfVar110[2];
        fVar210 = pfVar6[3] - pfVar110[3];
        fVar258 = *pfVar4 + *pfVar5;
        fVar263 = pfVar4[1] + pfVar5[1];
        fVar264 = pfVar4[2] + pfVar5[2];
        fVar265 = pfVar4[3] + pfVar5[3];
        fVar228 = *pfVar7 - *pfVar8;
        fVar237 = pfVar7[1] - pfVar8[1];
        fVar238 = pfVar7[2] - pfVar8[2];
        fVar239 = pfVar7[3] - pfVar8[3];
        fVar211 = *pfVar2 - *pfVar3;
        fVar225 = pfVar2[1] - pfVar3[1];
        fVar226 = pfVar2[2] - pfVar3[2];
        fVar227 = pfVar2[3] - pfVar3[3];
        fVar176 = *pfVar4 - *pfVar5;
        fVar196 = pfVar4[1] - pfVar5[1];
        fVar197 = pfVar4[2] - pfVar5[2];
        fVar198 = pfVar4[3] - pfVar5[3];
        fVar334 = (float)DAT_001e6730;
        fVar344 = DAT_001e6730._4_4_;
        fVar346 = DAT_001e6730._8_4_;
        fVar348 = DAT_001e6730._12_4_;
        fVar287 = (fVar240 + fVar266) * fVar334;
        fVar311 = (fVar255 + fVar282) * fVar344;
        fVar312 = (fVar256 + fVar283) * fVar346;
        fVar313 = (fVar257 + fVar284) * fVar348;
        fVar314 = (fVar115 + fVar258) * fVar334;
        fVar323 = (fVar173 + fVar263) * fVar344;
        fVar324 = (fVar174 + fVar264) * fVar346;
        fVar325 = (fVar175 + fVar265) * fVar348;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xe0) + lVar112);
        *pfVar110 = (fVar287 + fVar314) * 0.5;
        pfVar110[1] = (fVar311 + fVar323) * 0.5;
        pfVar110[2] = (fVar312 + fVar324) * 0.5;
        pfVar110[3] = (fVar313 + fVar325) * 0.5;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x60) + lVar112);
        *pfVar110 = (fVar287 - fVar314) * 0.5;
        pfVar110[1] = (fVar311 - fVar323) * 0.5;
        pfVar110[2] = (fVar312 - fVar324) * 0.5;
        pfVar110[3] = (fVar313 - fVar325) * 0.5;
        fVar287 = fVar228 - fVar176;
        fVar311 = fVar237 - fVar196;
        fVar312 = fVar238 - fVar197;
        fVar313 = fVar239 - fVar198;
        fVar240 = fVar240 - fVar266;
        fVar255 = fVar255 - fVar282;
        fVar256 = fVar256 - fVar283;
        fVar257 = fVar257 - fVar284;
        fVar266 = (float)DAT_001e6750;
        fVar282 = DAT_001e6750._4_4_;
        fVar283 = DAT_001e6750._8_4_;
        fVar284 = DAT_001e6750._12_4_;
        fVar314 = (float)DAT_001e6760;
        fVar323 = DAT_001e6760._4_4_;
        fVar324 = DAT_001e6760._8_4_;
        fVar325 = DAT_001e6760._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xa0) + lVar112);
        *pfVar110 = fVar240 * fVar314 + fVar287 * fVar266;
        pfVar110[1] = fVar255 * fVar323 + fVar311 * fVar282;
        pfVar110[2] = fVar256 * fVar324 + fVar312 * fVar283;
        pfVar110[3] = fVar257 * fVar325 + fVar313 * fVar284;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x20) + lVar112);
        *pfVar110 = fVar240 * fVar266 - fVar287 * fVar314;
        pfVar110[1] = fVar255 * fVar282 - fVar311 * fVar323;
        pfVar110[2] = fVar256 * fVar283 - fVar312 * fVar324;
        pfVar110[3] = fVar257 * fVar284 - fVar313 * fVar325;
        fVar334 = (fVar115 - fVar258) * fVar334;
        fVar344 = (fVar173 - fVar263) * fVar344;
        fVar346 = (fVar174 - fVar264) * fVar346;
        fVar348 = (fVar175 - fVar265) * fVar348;
        fVar115 = (fVar176 + fVar228) * -0.70710677;
        fVar173 = (fVar196 + fVar237) * -0.70710677;
        fVar174 = (fVar197 + fVar238) * -0.70710677;
        fVar175 = (fVar198 + fVar239) * -0.70710677;
        fVar176 = fVar199 - fVar334;
        fVar196 = fVar208 - fVar344;
        fVar197 = fVar209 - fVar346;
        fVar198 = fVar210 - fVar348;
        fVar228 = fVar211 + fVar115;
        fVar237 = fVar225 + fVar173;
        fVar238 = fVar226 + fVar174;
        fVar239 = fVar227 + fVar175;
        fVar240 = (float)DAT_001e6780;
        fVar255 = DAT_001e6780._4_4_;
        fVar256 = DAT_001e6780._8_4_;
        fVar257 = DAT_001e6780._12_4_;
        fVar258 = (float)DAT_001e6790;
        fVar263 = DAT_001e6790._4_4_;
        fVar264 = DAT_001e6790._8_4_;
        fVar265 = DAT_001e6790._12_4_;
        in_ZMM7._0_4_ = fVar228 * fVar258;
        in_ZMM7._4_4_ = fVar237 * fVar263;
        in_ZMM7._8_4_ = fVar238 * fVar264;
        in_ZMM7._12_4_ = fVar239 * fVar265;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x80) + lVar112);
        *pfVar110 = fVar176 * fVar240 - in_ZMM7._0_4_;
        pfVar110[1] = fVar196 * fVar255 - in_ZMM7._4_4_;
        pfVar110[2] = fVar197 * fVar256 - in_ZMM7._8_4_;
        pfVar110[3] = fVar198 * fVar257 - in_ZMM7._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0x40) + lVar112);
        *pfVar110 = fVar228 * fVar240 + fVar176 * fVar258;
        pfVar110[1] = fVar237 * fVar255 + fVar196 * fVar263;
        pfVar110[2] = fVar238 * fVar256 + fVar197 * fVar264;
        pfVar110[3] = fVar239 * fVar257 + fVar198 * fVar265;
        fVar334 = fVar334 + fVar199;
        fVar344 = fVar344 + fVar208;
        fVar346 = fVar346 + fVar209;
        fVar348 = fVar348 + fVar210;
        fVar115 = fVar115 - fVar211;
        fVar173 = fVar173 - fVar225;
        fVar174 = fVar174 - fVar226;
        fVar175 = fVar175 - fVar227;
        fVar176 = (float)DAT_001e67b0;
        fVar196 = DAT_001e67b0._4_4_;
        fVar197 = DAT_001e67b0._8_4_;
        fVar198 = DAT_001e67b0._12_4_;
        pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + -0xc0) + lVar112);
        *pfVar110 = fVar334 * 0.49039263 - fVar115 * fVar176;
        pfVar110[1] = fVar344 * 0.49039263 - fVar173 * fVar196;
        pfVar110[2] = fVar346 * 0.49039263 - fVar174 * fVar197;
        pfVar110[3] = fVar348 * 0.49039263 - fVar175 * fVar198;
        in_ZMM0._0_4_ = fVar334 * fVar176;
        in_ZMM0._4_4_ = fVar344 * fVar196;
        in_ZMM0._8_4_ = fVar346 * fVar197;
        in_ZMM0._12_4_ = fVar348 * fVar198;
        pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
        *pfVar110 = fVar115 * 0.49039263 + in_ZMM0._0_4_;
        pfVar110[1] = fVar173 * 0.49039263 + in_ZMM0._4_4_;
        pfVar110[2] = fVar174 * 0.49039263 + in_ZMM0._8_4_;
        pfVar110[3] = fVar175 * 0.49039263 + in_ZMM0._12_4_;
        lVar112 = lVar112 + 0x10;
      }
      uVar60 = *(undefined4 *)((undefined1 *)local_108._buffer + 4);
      uVar61 = *(undefined4 *)((undefined1 *)local_108._buffer + 8);
      uVar62 = *(undefined4 *)((undefined1 *)local_108._buffer + 0xc);
      uVar63 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      uVar64 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      uVar65 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      uVar66 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      uVar68 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      uVar70 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      uVar71 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      uVar72 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      uVar73 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      uVar74 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      uVar76 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      uVar77 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      uVar78 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      uVar79 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      uVar80 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      uVar81 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      uVar82 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      uVar83 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      uVar84 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      uVar85 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      uVar86 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      uVar87 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      uVar88 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      uVar89 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      auVar117 = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar118 = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      *(undefined4 *)(undefined1 *)local_108._buffer =
           *(undefined4 *)(undefined1 *)local_108._buffer;
      *(undefined4 *)((undefined1 *)local_108._buffer + 4) =
           *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      *(undefined4 *)((undefined1 *)local_108._buffer + 8) = uVar74;
      *(undefined4 *)((undefined1 *)local_108._buffer + 0xc) = uVar78;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = uVar68;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = uVar76;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = uVar80;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = uVar75;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = uVar79;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = uVar62;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = uVar69;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = uVar77;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = uVar81;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = uVar82;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = uVar86;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = auVar117._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = auVar118._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = uVar84;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = uVar88;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = auVar117._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = auVar118._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = uVar83;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = uVar87;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = auVar117._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = auVar118._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = uVar85;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = uVar89;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = auVar117._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = auVar118._12_4_;
      auVar117 = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar118 = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      uVar60 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      uVar61 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      uVar62 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      uVar68 = *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      uVar74 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      auVar119 = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar120 = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      in_ZMM7._8_8_ = auVar120._8_8_;
      in_ZMM7._0_8_ = auVar119._8_8_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = uVar63;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = uVar70;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = auVar117._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = auVar118._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = uVar65;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = uVar72;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = auVar117._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = auVar118._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = uVar64;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = uVar71;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = auVar117._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = auVar118._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = uVar66;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = uVar73;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = auVar117._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = auVar118._12_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = uVar68;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = auVar119._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = auVar120._0_4_;
      auVar117._4_4_ = uVar74;
      auVar117._0_4_ = uVar62;
      auVar117._8_4_ = auVar119._8_4_;
      auVar117._12_4_ = auVar120._8_4_;
      in_ZMM0._0_16_ = auVar117;
      *(undefined1 (*) [16])((long)local_108._buffer + 0x50) = auVar117;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = uVar69;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = auVar119._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = auVar120._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = uVar75;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = auVar119._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = auVar120._12_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_108._buffer);
    in_ZMM0._0_12_ = ZEXT812(0x3ca3d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,0.001);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, DC Only");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    dVar116 = (double)Imath_2_5::erand48(local_e6);
    *(float *)(undefined1 *)local_108._buffer = (float)dVar116;
    *local_f8._buffer = (float)dVar116;
    for (lVar112 = 1; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      *(undefined4 *)((undefined1 *)local_108._buffer + lVar112 * 4) = 0;
      local_f8._buffer[lVar112] = 0.0;
    }
    in_ZMM0._16_48_ = extraout_var_23;
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    fVar115 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 * 0.3535536;
    for (lVar112 = 0; lVar112 != 0x100; lVar112 = lVar112 + 0x10) {
      pfVar110 = (float *)((undefined1 *)local_108._buffer + lVar112);
      *pfVar110 = fVar115;
      pfVar110[1] = fVar115;
      pfVar110[2] = fVar115;
      pfVar110[3] = fVar115;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, Scalar: ");
  std::endl<char,std::char_traits<char>>(poVar106);
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"8x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
      auVar142._0_8_ = (double)Imath_2_5::erand48(local_e6);
      auVar142._8_56_ = extraout_var_00;
      in_ZMM0._4_60_ = auVar142._4_60_;
      in_ZMM0._0_4_ = (float)auVar142._0_8_;
      *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[lVar112] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_108._buffer);
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"7x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x38) {
        auVar143._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar143._8_56_ = extraout_var_01;
        in_ZMM0._4_60_ = auVar143._4_60_;
        in_ZMM0._0_4_ = (float)auVar143._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xe0; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar118._0_4_ = fVar176 + fVar334;
      auVar118._4_4_ = fVar196 + fVar115;
      auVar118._8_4_ = fVar197 + fVar346;
      auVar118._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar118;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar118;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar144._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar271._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar271._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar271._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar144._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar144._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar144._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"6x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x30) {
        auVar145._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar145._8_56_ = extraout_var_02;
        in_ZMM0._4_60_ = auVar145._4_60_;
        in_ZMM0._0_4_ = (float)auVar145._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xc0; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar119._0_4_ = fVar176 + fVar334;
      auVar119._4_4_ = fVar196 + fVar115;
      auVar119._8_4_ = fVar197 + fVar346;
      auVar119._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar119;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar119;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar146._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar272._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar272._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar272._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar146._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar146._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar146._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"5x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x28) {
        auVar147._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar147._8_56_ = extraout_var_03;
        in_ZMM0._4_60_ = auVar147._4_60_;
        in_ZMM0._0_4_ = (float)auVar147._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0xa0; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar120._0_4_ = fVar176 + fVar334;
      auVar120._4_4_ = fVar196 + fVar115;
      auVar120._8_4_ = fVar197 + fVar346;
      auVar120._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar120;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar120;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar148._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar273._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar273._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar273._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar148._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar148._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar148._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"4x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x20) {
        auVar149._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar149._8_56_ = extraout_var_04;
        in_ZMM0._4_60_ = auVar149._4_60_;
        in_ZMM0._0_4_ = (float)auVar149._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x80; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar121._0_4_ = fVar176 + fVar334;
      auVar121._4_4_ = fVar196 + fVar115;
      auVar121._8_4_ = fVar197 + fVar346;
      auVar121._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar121;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar121;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar150._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar274._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar274._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar274._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar150._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar150._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar150._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"3x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x18) {
        auVar151._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar151._8_56_ = extraout_var_05;
        in_ZMM0._4_60_ = auVar151._4_60_;
        in_ZMM0._0_4_ = (float)auVar151._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x60; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar122._0_4_ = fVar176 + fVar334;
      auVar122._4_4_ = fVar196 + fVar115;
      auVar122._8_4_ = fVar197 + fVar346;
      auVar122._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar122;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar122;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar152._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar275._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar275._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar275._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar152._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar152._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar152._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"2x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 0x10) {
        auVar153._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar153._8_56_ = extraout_var_06;
        in_ZMM0._4_60_ = auVar153._4_60_;
        in_ZMM0._0_4_ = (float)auVar153._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 0x20) {
      fVar174 = (*(float *)((undefined1 *)local_108._buffer + lVar112) +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar346 = (*(float *)((undefined1 *)local_108._buffer + lVar112) -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112)) *
                0.35355362;
      fVar348 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 8) *
                0.19134216 + *(float *)((undefined1 *)local_108._buffer + lVar112 + 8) * 0.46193984;
      fVar115 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 0xc);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + lVar112 + 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 4);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112 + 0xc);
      fVar176 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
      fVar196 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
      fVar197 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
      fVar173 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
      fVar115 = fVar348 + fVar346;
      fVar334 = fVar175 + fVar174;
      fVar174 = fVar174 - fVar175;
      fVar346 = fVar346 - fVar348;
      auVar123._0_4_ = fVar176 + fVar334;
      auVar123._4_4_ = fVar196 + fVar115;
      auVar123._8_4_ = fVar197 + fVar346;
      auVar123._12_4_ = fVar173 + fVar174;
      in_ZMM0._0_16_ = auVar123;
      *(undefined1 (*) [16])((undefined1 *)local_108._buffer + lVar112) = auVar123;
      pfVar110 = (float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + lVar112);
      *pfVar110 = fVar174 - fVar173;
      pfVar110[1] = fVar346 - fVar197;
      pfVar110[2] = fVar115 - fVar196;
      pfVar110[3] = fVar334 - fVar176;
    }
    for (lVar112 = -8; auVar154._16_48_ = in_ZMM0._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar276._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar276._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar276._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar154._0_16_ = ZEXT416((uint)fVar175);
      in_ZMM0._4_60_ = auVar154._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      in_ZMM0._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           in_ZMM0._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar154._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  poVar106 = std::operator<<((ostream *)&std::cout,"         ");
  poVar106 = std::operator<<(poVar106,"1x8");
  std::endl<char,std::char_traits<char>>(poVar106);
  for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
    for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
      in_ZMM0._0_16_ = ZEXT816(0);
      if (uVar113 < 8) {
        auVar155._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar155._8_56_ = extraout_var_07;
        in_ZMM0._4_60_ = auVar155._4_60_;
        in_ZMM0._0_4_ = (float)auVar155._0_8_;
      }
      *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
      local_f8._buffer[uVar113] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
    fVar174 = (*(float *)(undefined1 *)local_108._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10)) * 0.35355362;
    fVar346 = (*(float *)(undefined1 *)local_108._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10)) * 0.35355362;
    fVar348 = *(float *)((undefined1 *)local_108._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) * 0.46193984;
    fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_108._buffer + 8) * 0.46193984;
    fVar115 = *(float *)((undefined1 *)local_108._buffer + 0xc);
    fVar334 = *(float *)((undefined1 *)local_108._buffer + 4);
    fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
    fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
    fVar176 = fVar344 * 0.097545706 +
              fVar173 * 0.27778545 + fVar334 * 0.49039266 + fVar115 * 0.41573495;
    fVar196 = fVar344 * -0.27778545 +
              fVar173 * -0.49039266 + fVar334 * 0.41573495 + fVar115 * -0.097545706;
    fVar197 = fVar344 * 0.41573495 +
              fVar173 * 0.097545706 + fVar334 * 0.27778545 + fVar115 * -0.49039266;
    fVar173 = fVar344 * -0.49039266 +
              fVar173 * 0.41573495 + fVar334 * 0.097545706 + fVar115 * -0.27778545;
    fVar115 = fVar348 + fVar346;
    fVar334 = fVar175 + fVar174;
    fVar174 = fVar174 - fVar175;
    fVar346 = fVar346 - fVar348;
    auVar124._0_4_ = fVar176 + fVar334;
    auVar124._4_4_ = fVar196 + fVar115;
    auVar124._8_4_ = fVar197 + fVar346;
    auVar124._12_4_ = fVar173 + fVar174;
    auVar157._16_48_ = in_ZMM0._16_48_;
    auVar157._0_16_ = auVar124;
    *(undefined1 (*) [16])local_108._buffer = auVar124;
    *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar174 - fVar173;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar346 - fVar197;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar115 - fVar196;
    *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar334 - fVar176;
    for (lVar112 = -8; auVar156._16_48_ = auVar157._16_48_, lVar112 != 0; lVar112 = lVar112 + 1) {
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.19134216 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.46193984;
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) *
                0.19134216 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) *
                0.46193984;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4);
      auVar277._16_48_ = in_ZMM7._16_48_;
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4);
      fVar348 = fVar344 * 0.097545706 +
                fVar173 * 0.27778545 + fVar115 * 0.49039266 + fVar334 * 0.41573495;
      fVar176 = fVar344 * -0.27778545 +
                fVar173 * -0.49039266 + fVar115 * 0.41573495 + fVar334 * -0.097545706;
      fVar196 = fVar344 * 0.41573495 +
                fVar173 * 0.097545706 + fVar115 * 0.27778545 + fVar334 * -0.49039266;
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4);
      fVar334 = fVar344 * -0.49039266 +
                fVar173 * 0.41573495 + fVar115 * 0.097545706 + fVar334 * -0.27778545;
      auVar277._0_16_ = ZEXT416((uint)fVar174);
      in_ZMM7._4_60_ = auVar277._4_60_;
      fVar344 = (fVar174 +
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar174 = (fVar174 -
                *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4)) *
                0.35355362;
      fVar173 = fVar346 + fVar174;
      fVar174 = fVar174 - fVar346;
      auVar156._0_16_ = ZEXT416((uint)fVar175);
      auVar157._4_60_ = auVar156._4_60_;
      fVar115 = fVar175 + fVar344;
      fVar344 = fVar344 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + lVar112 * 4) =
           fVar348 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + lVar112 * 4) =
           fVar176 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + lVar112 * 4) =
           fVar196 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + lVar112 * 4) =
           fVar334 + fVar344;
      in_ZMM7._0_4_ = fVar344 - fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + lVar112 * 4) =
           in_ZMM7._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + lVar112 * 4) =
           fVar174 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + lVar112 * 4) =
           fVar173 - fVar176;
      auVar157._0_4_ = fVar115 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x100) + lVar112 * 4) =
           auVar157._0_4_;
    }
    in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
    in_ZMM0._12_4_ = 0.0;
    in_ZMM0._16_48_ = auVar156._16_48_;
    compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
  }
  Imf_2_5::CpuId::CpuId(local_5f);
  if (local_5f[0].sse2 == true) {
    poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, SSE2: ");
    std::endl<char,std::char_traits<char>>(poVar106);
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"8x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      lVar112 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (lVar112 == 0x40) break;
        auVar158._0_8_ = (double)Imath_2_5::erand48(local_e6);
        auVar158._8_56_ = extraout_var_08;
        in_ZMM0._4_60_ = auVar158._4_60_;
        in_ZMM0._0_4_ = (float)auVar158._0_8_;
        *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[lVar112] = in_ZMM0._0_4_;
        lVar112 = lVar112 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar212._0_4_ = fVar176 + fVar228;
        auVar212._4_4_ = fVar196 + fVar237;
        auVar212._8_4_ = fVar197 + fVar238;
        auVar212._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar212;
        auVar241._0_4_ = fVar228 - fVar176;
        auVar241._4_4_ = fVar237 - fVar196;
        auVar241._8_4_ = fVar238 - fVar197;
        auVar241._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar241;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar288._0_4_ = fVar258 - fVar211;
        auVar288._4_4_ = fVar263 - fVar225;
        auVar288._8_4_ = fVar264 - fVar226;
        auVar288._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar288;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"7x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x38) {
          auVar159._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar159._8_56_ = extraout_var_09;
          in_ZMM0._4_60_ = auVar159._4_60_;
          in_ZMM0._0_4_ = (float)auVar159._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar213._0_4_ = fVar176 + fVar228;
        auVar213._4_4_ = fVar196 + fVar237;
        auVar213._8_4_ = fVar197 + fVar238;
        auVar213._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar213;
        auVar242._0_4_ = fVar228 - fVar176;
        auVar242._4_4_ = fVar237 - fVar196;
        auVar242._8_4_ = fVar238 - fVar197;
        auVar242._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar242;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar289._0_4_ = fVar258 - fVar211;
        auVar289._4_4_ = fVar263 - fVar225;
        auVar289._8_4_ = fVar264 - fVar226;
        auVar289._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar289;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"6x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x30) {
          auVar160._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar160._8_56_ = extraout_var_10;
          in_ZMM0._4_60_ = auVar160._4_60_;
          in_ZMM0._0_4_ = (float)auVar160._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar214._0_4_ = fVar176 + fVar228;
        auVar214._4_4_ = fVar196 + fVar237;
        auVar214._8_4_ = fVar197 + fVar238;
        auVar214._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar214;
        auVar243._0_4_ = fVar228 - fVar176;
        auVar243._4_4_ = fVar237 - fVar196;
        auVar243._8_4_ = fVar238 - fVar197;
        auVar243._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar243;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar290._0_4_ = fVar258 - fVar211;
        auVar290._4_4_ = fVar263 - fVar225;
        auVar290._8_4_ = fVar264 - fVar226;
        auVar290._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar290;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"5x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x28) {
          auVar161._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar161._8_56_ = extraout_var_11;
          in_ZMM0._4_60_ = auVar161._4_60_;
          in_ZMM0._0_4_ = (float)auVar161._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar215._0_4_ = fVar176 + fVar228;
        auVar215._4_4_ = fVar196 + fVar237;
        auVar215._8_4_ = fVar197 + fVar238;
        auVar215._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar215;
        auVar244._0_4_ = fVar228 - fVar176;
        auVar244._4_4_ = fVar237 - fVar196;
        auVar244._8_4_ = fVar238 - fVar197;
        auVar244._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar244;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar291._0_4_ = fVar258 - fVar211;
        auVar291._4_4_ = fVar263 - fVar225;
        auVar291._8_4_ = fVar264 - fVar226;
        auVar291._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar291;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"4x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x20) {
          auVar162._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar162._8_56_ = extraout_var_12;
          in_ZMM0._4_60_ = auVar162._4_60_;
          in_ZMM0._0_4_ = (float)auVar162._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar216._0_4_ = fVar176 + fVar228;
        auVar216._4_4_ = fVar196 + fVar237;
        auVar216._8_4_ = fVar197 + fVar238;
        auVar216._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar216;
        auVar245._0_4_ = fVar228 - fVar176;
        auVar245._4_4_ = fVar237 - fVar196;
        auVar245._8_4_ = fVar238 - fVar197;
        auVar245._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar245;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar292._0_4_ = fVar258 - fVar211;
        auVar292._4_4_ = fVar263 - fVar225;
        auVar292._8_4_ = fVar264 - fVar226;
        auVar292._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar292;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"3x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x18) {
          auVar163._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar163._8_56_ = extraout_var_13;
          in_ZMM0._4_60_ = auVar163._4_60_;
          in_ZMM0._0_4_ = (float)auVar163._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      fVar115 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4);
      fVar334 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8);
      fVar173 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc);
      fVar348 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) * 0.3535536 + 0.0;
      fVar176 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar196 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar197 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar334 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar344 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar346 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar348 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar176 + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar196 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar197 + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar334 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar334 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar197 - fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar196 - fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar176 - fVar344;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar217._0_4_ = fVar176 + fVar228;
        auVar217._4_4_ = fVar196 + fVar237;
        auVar217._8_4_ = fVar197 + fVar238;
        auVar217._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar217;
        auVar246._0_4_ = fVar228 - fVar176;
        auVar246._4_4_ = fVar237 - fVar196;
        auVar246._8_4_ = fVar238 - fVar197;
        auVar246._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar246;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar293._0_4_ = fVar258 - fVar211;
        auVar293._4_4_ = fVar263 - fVar225;
        auVar293._8_4_ = fVar264 - fVar226;
        auVar293._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar293;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"2x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      uVar113 = 0;
      while( true ) {
        auVar285 = in_ZMM7._16_48_;
        if (uVar113 == 0x40) break;
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x10) {
          auVar164._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar164._8_56_ = extraout_var_14;
          in_ZMM0._4_60_ = auVar164._4_60_;
          in_ZMM0._0_4_ = (float)auVar164._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
        uVar113 = uVar113 + 1;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar227 = (float)DAT_001e6840;
      fVar228 = DAT_001e6840._4_4_;
      fVar237 = DAT_001e6840._8_4_;
      fVar238 = DAT_001e6840._12_4_;
      in_ZMM7._16_48_ = auVar285;
      in_ZMM7._0_16_ = _DAT_001e6840;
      fVar239 = (float)DAT_001e6850;
      fVar240 = DAT_001e6850._4_4_;
      fVar255 = DAT_001e6850._8_4_;
      fVar256 = DAT_001e6850._12_4_;
      fVar199 = fVar348 + fVar334 * 0.4619398 + fVar344 * fVar227 + fVar346 * fVar239;
      fVar208 = fVar348 + fVar334 * 0.1913422 + fVar344 * fVar228 + fVar346 * fVar240;
      fVar209 = fVar348 + fVar334 * -0.1913422 + fVar344 * fVar237 + fVar346 * fVar255;
      fVar210 = fVar348 + fVar334 * -0.4619398 + fVar344 * fVar238 + fVar346 * fVar256;
      fVar334 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      fVar344 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8);
      fVar348 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc);
      fVar257 = (float)DAT_001e6860;
      fVar258 = DAT_001e6860._4_4_;
      fVar263 = DAT_001e6860._8_4_;
      fVar264 = DAT_001e6860._12_4_;
      fVar265 = (float)DAT_001e6870;
      fVar266 = DAT_001e6870._4_4_;
      fVar282 = DAT_001e6870._8_4_;
      fVar283 = DAT_001e6870._12_4_;
      fVar284 = (float)DAT_001e6880;
      fVar287 = DAT_001e6880._4_4_;
      fVar311 = DAT_001e6880._8_4_;
      fVar312 = DAT_001e6880._12_4_;
      fVar176 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      fVar196 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4);
      fVar197 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8);
      fVar198 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc);
      fVar313 = (float)DAT_001e6890;
      fVar314 = DAT_001e6890._4_4_;
      fVar323 = DAT_001e6890._8_4_;
      fVar324 = DAT_001e6890._12_4_;
      fVar211 = fVar115 * fVar257 + 0.0 + fVar173 * fVar265 + fVar174 * fVar284 + fVar175 * fVar313;
      fVar225 = fVar115 * fVar258 + 0.0 + fVar173 * fVar266 + fVar174 * fVar287 + fVar175 * fVar314;
      fVar226 = fVar115 * fVar263 + 0.0 + fVar173 * fVar282 + fVar174 * fVar311 + fVar175 * fVar323;
      fVar115 = fVar115 * fVar264 + 0.0 + fVar173 * fVar283 + fVar174 * fVar312 + fVar175 * fVar324;
      *(float *)(undefined1 *)local_108._buffer = fVar199 + fVar211;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar208 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar209 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar210 + fVar115;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar210 - fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar209 - fVar226;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar208 - fVar225;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar199 - fVar211;
      fVar115 = fVar334 * 0.3535536 + 0.0;
      fVar334 = fVar115 + fVar346 * 0.4619398 + fVar176 * fVar227 + fVar197 * fVar239;
      fVar173 = fVar115 + fVar346 * 0.1913422 + fVar176 * fVar228 + fVar197 * fVar240;
      fVar174 = fVar115 + fVar346 * -0.1913422 + fVar176 * fVar237 + fVar197 * fVar255;
      fVar115 = fVar115 + fVar346 * -0.4619398 + fVar176 * fVar238 + fVar197 * fVar256;
      fVar346 = fVar344 * fVar257 + 0.0 + fVar348 * fVar265 + fVar196 * fVar284 + fVar198 * fVar313;
      fVar175 = fVar344 * fVar258 + 0.0 + fVar348 * fVar266 + fVar196 * fVar287 + fVar198 * fVar314;
      fVar176 = fVar344 * fVar263 + 0.0 + fVar348 * fVar282 + fVar196 * fVar311 + fVar198 * fVar323;
      fVar344 = fVar344 * fVar264 + 0.0 + fVar348 * fVar283 + fVar196 * fVar312 + fVar198 * fVar324;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar334 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar173 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar174 + fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar115 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar115 - fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar173 - fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar334 - fVar346;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar218._0_4_ = fVar176 + fVar228;
        auVar218._4_4_ = fVar196 + fVar237;
        auVar218._8_4_ = fVar197 + fVar238;
        auVar218._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar218;
        auVar247._0_4_ = fVar228 - fVar176;
        auVar247._4_4_ = fVar237 - fVar196;
        auVar247._8_4_ = fVar238 - fVar197;
        auVar247._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar247;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar294._0_4_ = fVar258 - fVar211;
        auVar294._4_4_ = fVar263 - fVar225;
        auVar294._8_4_ = fVar264 - fVar226;
        auVar294._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar294;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"1x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 8) {
          auVar165._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar165._8_56_ = extraout_var_15;
          in_ZMM0._4_60_ = auVar165._4_60_;
          in_ZMM0._0_4_ = (float)auVar165._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      fVar115 = *(float *)((undefined1 *)local_108._buffer + 4);
      fVar334 = *(float *)((undefined1 *)local_108._buffer + 8);
      fVar173 = *(float *)((undefined1 *)local_108._buffer + 0xc);
      fVar344 = *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      fVar174 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4);
      fVar346 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8);
      fVar175 = *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc);
      fVar348 = fVar175 * 0.09754573 +
                fVar174 * 0.2777855 + fVar173 * 0.4157349 + fVar115 * 0.4903927 + 0.0;
      fVar176 = fVar175 * -0.2777855 +
                fVar174 * -0.4903927 + fVar173 * -0.09754573 + fVar115 * 0.4157349 + 0.0;
      fVar196 = fVar175 * 0.4157349 +
                fVar174 * 0.09754573 + fVar173 * -0.4903927 + fVar115 * 0.2777855 + 0.0;
      fVar197 = fVar175 * -0.4903927 +
                fVar174 * 0.4157349 + fVar173 * -0.2777855 + fVar115 * 0.09754573 + 0.0;
      fVar115 = *(float *)(undefined1 *)local_108._buffer * 0.3535536 + 0.0;
      fVar173 = fVar115 + fVar334 * 0.4619398 + fVar344 * 0.3535536 + fVar346 * 0.1913422;
      fVar174 = fVar115 + fVar334 * 0.1913422 + fVar344 * -0.3535536 + fVar346 * -0.4619398;
      fVar175 = fVar115 + fVar334 * -0.1913422 + fVar344 * -0.3535536 + fVar346 * 0.4619398;
      fVar115 = fVar115 + fVar334 * -0.4619398 + fVar344 * 0.3535536 + fVar346 * -0.1913422;
      *(float *)(undefined1 *)local_108._buffer = fVar173 + fVar348;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar174 + fVar176;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar175 + fVar196;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar115 + fVar197;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar115 - fVar197;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar175 - fVar196;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar174 - fVar176;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = fVar173 - fVar348;
      pauVar107 = (undefined1 (*) [16])local_108._buffer;
      for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
        for (lVar108 = 0; lVar108 != 0x80; lVar108 = lVar108 + 0x10) {
          uVar90 = *(undefined8 *)((long)(*pauVar107 + lVar108 * 2) + 8);
          *(undefined8 *)((long)&local_e0 + lVar108) = *(undefined8 *)(*pauVar107 + lVar108 * 2);
          *(undefined8 *)((long)&fStack_d8 + lVar108) = uVar90;
        }
        fVar174 = local_c0 * 0.1913422 - local_80 * 0.4619398;
        fVar346 = fStack_bc * 0.1913422 - fStack_7c * 0.4619398;
        fVar175 = fStack_b8 * 0.1913422 - fStack_78 * 0.4619398;
        fVar348 = fStack_b4 * 0.1913422 - fStack_74 * 0.4619398;
        fVar199 = local_80 * 0.1913422 + local_c0 * 0.4619398;
        fVar208 = fStack_7c * 0.1913422 + fStack_bc * 0.4619398;
        fVar209 = fStack_78 * 0.1913422 + fStack_b8 * 0.4619398;
        fVar210 = fStack_74 * 0.1913422 + fStack_b4 * 0.4619398;
        fVar176 = (float)DAT_001e68c0;
        fVar196 = DAT_001e68c0._4_4_;
        fVar197 = DAT_001e68c0._8_4_;
        fVar198 = DAT_001e68c0._12_4_;
        fVar228 = (float)DAT_001e68d0;
        fVar237 = DAT_001e68d0._4_4_;
        fVar238 = DAT_001e68d0._8_4_;
        fVar239 = DAT_001e68d0._12_4_;
        fVar240 = (float)DAT_001e68e0;
        fVar255 = DAT_001e68e0._4_4_;
        fVar256 = DAT_001e68e0._8_4_;
        fVar257 = DAT_001e68e0._12_4_;
        fVar258 = (float)DAT_001e68f0;
        fVar263 = DAT_001e68f0._4_4_;
        fVar264 = DAT_001e68f0._8_4_;
        fVar265 = DAT_001e68f0._12_4_;
        fVar115 = local_70 * fVar258 + local_90 * fVar240 + local_b0 * fVar228 + local_d0 * fVar176;
        fVar334 = fStack_6c * fVar263 + fStack_8c * fVar255 +
                  fStack_ac * fVar237 + fStack_cc * fVar196;
        fVar173 = fStack_68 * fVar264 + fStack_88 * fVar256 +
                  fStack_a8 * fVar238 + fStack_c8 * fVar197;
        fVar344 = fStack_64 * fVar265 + fStack_84 * fVar257 +
                  fStack_a4 * fVar239 + fStack_c4 * fVar198;
        fVar211 = (local_d0 * fVar228 - local_b0 * fVar258) -
                  (local_70 * fVar240 + local_90 * fVar176);
        fVar225 = (fStack_cc * fVar237 - fStack_ac * fVar263) -
                  (fStack_6c * fVar255 + fStack_8c * fVar196);
        fVar226 = (fStack_c8 * fVar238 - fStack_a8 * fVar264) -
                  (fStack_68 * fVar256 + fStack_88 * fVar197);
        fVar227 = (fStack_c4 * fVar239 - fStack_a4 * fVar265) -
                  (fStack_64 * fVar257 + fStack_84 * fVar198);
        in_ZMM7._0_4_ =
             local_70 * fVar228 + local_90 * fVar258 + (local_d0 * fVar240 - local_b0 * fVar176);
        in_ZMM7._4_4_ =
             fStack_6c * fVar237 + fStack_8c * fVar263 + (fStack_cc * fVar255 - fStack_ac * fVar196)
        ;
        in_ZMM7._8_4_ =
             fStack_68 * fVar238 + fStack_88 * fVar264 + (fStack_c8 * fVar256 - fStack_a8 * fVar197)
        ;
        in_ZMM7._12_4_ =
             fStack_64 * fVar239 + fStack_84 * fVar265 + (fStack_c4 * fVar257 - fStack_a4 * fVar198)
        ;
        fVar176 = (local_90 * fVar228 - local_70 * fVar176) +
                  (local_d0 * fVar258 - local_b0 * fVar240);
        fVar196 = (fStack_8c * fVar237 - fStack_6c * fVar196) +
                  (fStack_cc * fVar263 - fStack_ac * fVar255);
        fVar197 = (fStack_88 * fVar238 - fStack_68 * fVar197) +
                  (fStack_c8 * fVar264 - fStack_a8 * fVar256);
        fVar198 = (fStack_84 * fVar239 - fStack_64 * fVar198) +
                  (fStack_c4 * fVar265 - fStack_a4 * fVar257);
        fVar228 = (local_e0 + local_a0) * (float)DAT_001e6900;
        fVar237 = (fStack_dc + fStack_9c) * DAT_001e6900._4_4_;
        fVar238 = (fStack_d8 + fStack_98) * DAT_001e6900._8_4_;
        fVar239 = (fStack_d4 + fStack_94) * DAT_001e6900._12_4_;
        fVar240 = (local_e0 - local_a0) * (float)DAT_001e6900;
        fVar255 = (fStack_dc - fStack_9c) * DAT_001e6900._4_4_;
        fVar256 = (fStack_d8 - fStack_98) * DAT_001e6900._8_4_;
        fVar257 = (fStack_d4 - fStack_94) * DAT_001e6900._12_4_;
        fVar258 = fVar174 + fVar240;
        fVar263 = fVar346 + fVar255;
        fVar264 = fVar175 + fVar256;
        fVar265 = fVar348 + fVar257;
        fVar240 = fVar240 - fVar174;
        fVar255 = fVar255 - fVar346;
        fVar256 = fVar256 - fVar175;
        fVar257 = fVar257 - fVar348;
        fVar174 = fVar199 + fVar228;
        fVar346 = fVar208 + fVar237;
        fVar175 = fVar209 + fVar238;
        fVar348 = fVar210 + fVar239;
        fVar228 = fVar228 - fVar199;
        fVar237 = fVar237 - fVar208;
        fVar238 = fVar238 - fVar209;
        fVar239 = fVar239 - fVar210;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + lVar112 * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar174;
        *(float *)(*pauVar1 + 4) = fVar334 + fVar346;
        *(float *)(*pauVar1 + 8) = fVar173 + fVar175;
        *(float *)(*pauVar1 + 0xc) = fVar344 + fVar348;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 2) * 0x10);
        *(float *)*pauVar1 = fVar211 + fVar258;
        *(float *)(*pauVar1 + 4) = fVar225 + fVar263;
        *(float *)(*pauVar1 + 8) = fVar226 + fVar264;
        *(float *)(*pauVar1 + 0xc) = fVar227 + fVar265;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 4) * 0x10);
        *(float *)*pauVar1 = in_ZMM7._0_4_ + fVar240;
        *(float *)(*pauVar1 + 4) = in_ZMM7._4_4_ + fVar255;
        *(float *)(*pauVar1 + 8) = in_ZMM7._8_4_ + fVar256;
        *(float *)(*pauVar1 + 0xc) = in_ZMM7._12_4_ + fVar257;
        auVar219._0_4_ = fVar176 + fVar228;
        auVar219._4_4_ = fVar196 + fVar237;
        auVar219._8_4_ = fVar197 + fVar238;
        auVar219._12_4_ = fVar198 + fVar239;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 6) * 0x10) = auVar219;
        auVar248._0_4_ = fVar228 - fVar176;
        auVar248._4_4_ = fVar237 - fVar196;
        auVar248._8_4_ = fVar238 - fVar197;
        auVar248._12_4_ = fVar239 - fVar198;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 8) * 0x10) = auVar248;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 10) * 0x10);
        *(float *)*pauVar1 = fVar240 - in_ZMM7._0_4_;
        *(float *)(*pauVar1 + 4) = fVar255 - in_ZMM7._4_4_;
        *(float *)(*pauVar1 + 8) = fVar256 - in_ZMM7._8_4_;
        *(float *)(*pauVar1 + 0xc) = fVar257 - in_ZMM7._12_4_;
        auVar295._0_4_ = fVar258 - fVar211;
        auVar295._4_4_ = fVar263 - fVar225;
        auVar295._8_4_ = fVar264 - fVar226;
        auVar295._12_4_ = fVar265 - fVar227;
        *(undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xc) * 0x10) = auVar295;
        pauVar1 = (undefined1 (*) [16])((long)local_108._buffer + (lVar112 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar174 - fVar115;
        *(float *)(*pauVar1 + 4) = fVar346 - fVar334;
        *(float *)(*pauVar1 + 8) = fVar175 - fVar173;
        *(float *)(*pauVar1 + 0xc) = fVar348 - fVar344;
        pauVar107 = pauVar107 + 1;
      }
      in_ZMM0._0_12_ = ZEXT812(0x3c23d70a);
      in_ZMM0._12_4_ = 0.0;
      compareBufferRelative(&local_f8,&local_108,in_ZMM0._0_4_,1e-06);
    }
  }
  if (local_5f[0].avx == true) {
    poVar106 = std::operator<<((ostream *)&std::cout,"      Inverse, AVX: ");
    std::endl<char,std::char_traits<char>>(poVar106);
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"8x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (lVar112 = 0; lVar112 != 0x40; lVar112 = lVar112 + 1) {
        dVar116 = (double)Imath_2_5::erand48(local_e6);
        *(float *)((undefined1 *)local_108._buffer + lVar112 * 4) = (float)dVar116;
        local_f8._buffer[lVar112] = (float)dVar116;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar370._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar370._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar387._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar387._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar370,auVar387);
      auVar9 = vunpckhpd_avx(auVar370,auVar387);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar221 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar353._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar353._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar364._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar364._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar179 = vunpcklpd_avx(auVar353,auVar364);
      auVar10 = vunpckhpd_avx(auVar353,auVar364);
      auVar296 = vunpcklps_avx(auVar179,auVar10);
      auVar10 = vunpckhps_avx(auVar179,auVar10);
      auVar11 = vunpcklpd_avx(auVar296,auVar10);
      auVar10 = vunpckhpd_avx(auVar296,auVar10);
      auVar326._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar326._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar336._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar336._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar296 = vunpcklpd_avx(auVar326,auVar336);
      auVar179 = vunpckhpd_avx(auVar326,auVar336);
      auVar178 = vunpcklps_avx(auVar296,auVar179);
      auVar179 = vunpckhps_avx(auVar296,auVar179);
      auVar12 = vunpcklpd_avx(auVar178,auVar179);
      auVar179 = vunpckhpd_avx(auVar178,auVar179);
      auVar296._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      auVar296._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar315._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      auVar315._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar178 = vunpcklpd_avx(auVar296,auVar315);
      auVar296 = vunpckhpd_avx(auVar296,auVar315);
      auVar13 = vunpcklps_avx(auVar178,auVar296);
      auVar296 = vunpckhps_avx(auVar178,auVar296);
      auVar178 = vunpcklpd_avx(auVar13,auVar296);
      auVar296 = vunpckhpd_avx(auVar13,auVar296);
      auVar13 = vpermilps_avx(auVar221,0);
      auVar14 = vpermilps_avx(auVar221,0x55);
      auVar15 = vpermilps_avx(auVar221,0xaa);
      auVar221 = vpermilps_avx(auVar221,0xff);
      auVar125._0_4_ =
           local_e0 * auVar13._0_4_ + local_d0 * auVar14._0_4_ +
           local_c0 * auVar15._0_4_ + local_b0 * auVar221._0_4_;
      auVar125._4_4_ =
           fStack_dc * auVar13._4_4_ + fStack_cc * auVar14._4_4_ +
           fStack_bc * auVar15._4_4_ + fStack_ac * auVar221._4_4_;
      auVar125._8_4_ =
           fStack_d8 * auVar13._8_4_ + fStack_c8 * auVar14._8_4_ +
           fStack_b8 * auVar15._8_4_ + fStack_a8 * auVar221._8_4_;
      auVar125._12_4_ =
           fStack_d4 * auVar13._12_4_ + fStack_c4 * auVar14._12_4_ +
           fStack_b4 * auVar15._12_4_ + fStack_a4 * auVar221._12_4_;
      auVar125._16_4_ =
           local_e0 * auVar13._16_4_ + local_d0 * auVar14._16_4_ +
           local_c0 * auVar15._16_4_ + local_b0 * auVar221._16_4_;
      auVar125._20_4_ =
           fStack_dc * auVar13._20_4_ + fStack_cc * auVar14._20_4_ +
           fStack_bc * auVar15._20_4_ + fStack_ac * auVar221._20_4_;
      auVar125._24_4_ =
           fStack_d8 * auVar13._24_4_ + fStack_c8 * auVar14._24_4_ +
           fStack_b8 * auVar15._24_4_ + fStack_a8 * auVar221._24_4_;
      auVar125._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar221._28_4_;
      auVar221 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar177._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar13._0_4_ +
           local_c0 * auVar14._0_4_ + local_b0 * auVar11._0_4_;
      auVar177._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar13._4_4_ +
           fStack_bc * auVar14._4_4_ + fStack_ac * auVar11._4_4_;
      auVar177._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar13._8_4_ +
           fStack_b8 * auVar14._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar177._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar13._12_4_ +
           fStack_b4 * auVar14._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar177._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar13._16_4_ +
           local_c0 * auVar14._16_4_ + local_b0 * auVar11._16_4_;
      auVar177._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar13._20_4_ +
           fStack_bc * auVar14._20_4_ + fStack_ac * auVar11._20_4_;
      auVar177._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar13._24_4_ +
           fStack_b8 * auVar14._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar177._28_4_ = auVar221._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar221 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar200._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar12._0_4_;
      auVar200._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar12._4_4_;
      auVar200._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar12._8_4_;
      auVar200._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar12._12_4_;
      auVar200._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar12._16_4_;
      auVar200._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar12._20_4_;
      auVar200._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar12._24_4_;
      auVar200._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar221 = vpermilps_avx(auVar178,0);
      auVar11 = vpermilps_avx(auVar178,0x55);
      auVar12 = vpermilps_avx(auVar178,0xaa);
      auVar178 = vpermilps_avx(auVar178,0xff);
      auVar220._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar178._0_4_;
      auVar220._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar178._4_4_;
      auVar220._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar178._8_4_;
      auVar220._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar178._12_4_;
      auVar220._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar178._16_4_;
      auVar220._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar178._20_4_;
      auVar220._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar178._24_4_;
      auVar220._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar178._28_4_;
      auVar98._4_4_ = fStack_9c;
      auVar98._0_4_ = local_a0;
      auVar98._8_4_ = fStack_98;
      auVar98._12_4_ = fStack_94;
      auVar297._16_16_ = auVar98;
      auVar297._0_16_ = auVar98;
      auVar221 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar229._0_4_ =
           local_a0 * auVar221._0_4_ + local_90 * auVar11._0_4_ +
           local_80 * auVar12._0_4_ + local_70 * auVar9._0_4_;
      auVar229._4_4_ =
           fStack_9c * auVar221._4_4_ + fStack_8c * auVar11._4_4_ +
           fStack_7c * auVar12._4_4_ + fStack_6c * auVar9._4_4_;
      auVar229._8_4_ =
           fStack_98 * auVar221._8_4_ + fStack_88 * auVar11._8_4_ +
           fStack_78 * auVar12._8_4_ + fStack_68 * auVar9._8_4_;
      auVar229._12_4_ =
           fStack_94 * auVar221._12_4_ + fStack_84 * auVar11._12_4_ +
           fStack_74 * auVar12._12_4_ + fStack_64 * auVar9._12_4_;
      auVar229._16_4_ =
           local_a0 * auVar221._16_4_ + local_90 * auVar11._16_4_ +
           local_80 * auVar12._16_4_ + local_70 * auVar9._16_4_;
      auVar229._20_4_ =
           fStack_9c * auVar221._20_4_ + fStack_8c * auVar11._20_4_ +
           fStack_7c * auVar12._20_4_ + fStack_6c * auVar9._20_4_;
      auVar229._24_4_ =
           fStack_98 * auVar221._24_4_ + fStack_88 * auVar11._24_4_ +
           fStack_78 * auVar12._24_4_ + fStack_68 * auVar9._24_4_;
      auVar229._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar221 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar249._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar221._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar10._0_4_;
      auVar249._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar221._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar10._4_4_;
      auVar249._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar221._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar10._8_4_;
      auVar249._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar221._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar10._12_4_;
      auVar249._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar221._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar10._16_4_;
      auVar249._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar221._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar10._20_4_;
      auVar249._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar221._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar10._24_4_;
      auVar249._28_4_ = auVar9._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar179,0);
      auVar10 = vpermilps_avx(auVar179,0x55);
      auVar221 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar259._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar179._0_4_;
      auVar259._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar179._4_4_;
      auVar259._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar179._8_4_;
      auVar259._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar179._12_4_;
      auVar259._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar179._16_4_;
      auVar259._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar179._20_4_;
      auVar259._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar179._24_4_;
      auVar259._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar221._28_4_ + auVar179._28_4_;
      auVar9 = vpermilps_avx(auVar296,0);
      auVar10 = vpermilps_avx(auVar296,0x55);
      auVar179 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar267._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar179._0_4_ + local_70 * auVar296._0_4_;
      auVar267._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar179._4_4_ + fStack_6c * auVar296._4_4_;
      auVar267._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar179._8_4_ + fStack_68 * auVar296._8_4_;
      auVar267._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar179._12_4_ + fStack_64 * auVar296._12_4_;
      auVar267._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar179._16_4_ + local_70 * auVar296._16_4_;
      auVar267._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar179._20_4_ + fStack_6c * auVar296._20_4_;
      auVar267._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar179._24_4_ + fStack_68 * auVar296._24_4_;
      auVar267._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar179._28_4_ + auVar296._28_4_;
      auVar9 = vsubps_avx(auVar125,auVar229);
      auVar126._0_4_ = auVar125._0_4_ + auVar229._0_4_;
      auVar126._4_4_ = auVar125._4_4_ + auVar229._4_4_;
      auVar126._8_4_ = auVar125._8_4_ + auVar229._8_4_;
      auVar126._12_4_ = auVar125._12_4_ + auVar229._12_4_;
      auVar126._16_4_ = auVar125._16_4_ + auVar229._16_4_;
      auVar126._20_4_ = auVar125._20_4_ + auVar229._20_4_;
      auVar126._24_4_ = auVar125._24_4_ + auVar229._24_4_;
      auVar126._28_4_ = auVar125._28_4_ + auVar229._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar177,auVar249);
      auVar178._0_4_ = auVar177._0_4_ + auVar249._0_4_;
      auVar178._4_4_ = auVar177._4_4_ + auVar249._4_4_;
      auVar178._8_4_ = auVar177._8_4_ + auVar249._8_4_;
      auVar178._12_4_ = auVar177._12_4_ + auVar249._12_4_;
      auVar178._16_4_ = auVar177._16_4_ + auVar249._16_4_;
      auVar178._20_4_ = auVar177._20_4_ + auVar249._20_4_;
      auVar178._24_4_ = auVar177._24_4_ + auVar249._24_4_;
      auVar178._28_4_ = auVar177._28_4_ + auVar249._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar200,auVar259);
      auVar201._0_4_ = auVar200._0_4_ + auVar259._0_4_;
      auVar201._4_4_ = auVar200._4_4_ + auVar259._4_4_;
      auVar201._8_4_ = auVar200._8_4_ + auVar259._8_4_;
      auVar201._12_4_ = auVar200._12_4_ + auVar259._12_4_;
      auVar201._16_4_ = auVar200._16_4_ + auVar259._16_4_;
      auVar201._20_4_ = auVar200._20_4_ + auVar259._20_4_;
      auVar201._24_4_ = auVar200._24_4_ + auVar259._24_4_;
      auVar201._28_4_ = auVar200._28_4_ + auVar259._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar220,auVar267);
      auVar221._0_4_ = auVar220._0_4_ + auVar267._0_4_;
      auVar221._4_4_ = auVar220._4_4_ + auVar267._4_4_;
      auVar221._8_4_ = auVar220._8_4_ + auVar267._8_4_;
      auVar221._12_4_ = auVar220._12_4_ + auVar267._12_4_;
      auVar221._16_4_ = auVar220._16_4_ + auVar267._16_4_;
      auVar221._20_4_ = auVar220._20_4_ + auVar267._20_4_;
      auVar221._24_4_ = auVar220._24_4_ + auVar267._24_4_;
      auVar221._28_4_ = auVar220._28_4_ + auVar267._28_4_;
      auVar16 = vpermilps_avx(auVar9,0x1b);
      auVar296 = vperm2f128_avx(auVar16,auVar221,0x13);
      auVar221 = vperm2f128_avx(auVar16,auVar221,2);
      auVar179 = vperm2f128_avx(auVar15,auVar201,0x13);
      auVar11 = vperm2f128_avx(auVar15,auVar201,2);
      auVar12 = vperm2f128_avx(auVar14,auVar178,0x13);
      auVar178 = vperm2f128_avx(auVar14,auVar178,2);
      auVar9 = vperm2f128_avx(auVar10,auVar126,0x13);
      auVar13 = vperm2f128_avx(auVar10,auVar126,2);
      auVar125 = vpermilps_avx(auVar297,0xff);
      auVar126 = vpermilps_avx(auVar297,0xaa);
      auVar177 = vpermilps_avx(auVar297,0x55);
      auVar200 = vpermilps_avx(auVar297,0);
      fVar115 = auVar9._0_4_;
      fVar263 = auVar200._0_4_;
      fVar174 = auVar9._4_4_;
      fVar264 = auVar200._4_4_;
      fVar176 = auVar9._8_4_;
      fVar265 = auVar200._8_4_;
      fVar199 = auVar9._12_4_;
      fVar266 = auVar200._12_4_;
      fVar211 = auVar9._16_4_;
      fVar282 = auVar200._16_4_;
      fVar228 = auVar9._20_4_;
      fVar283 = auVar200._20_4_;
      fVar240 = auVar9._24_4_;
      fVar284 = auVar200._24_4_;
      fVar334 = auVar12._0_4_;
      fVar287 = auVar177._0_4_;
      fVar346 = auVar12._4_4_;
      fVar311 = auVar177._4_4_;
      fVar196 = auVar12._8_4_;
      fVar312 = auVar177._8_4_;
      fVar208 = auVar12._12_4_;
      fVar313 = auVar177._12_4_;
      fVar225 = auVar12._16_4_;
      fVar314 = auVar177._16_4_;
      fVar237 = auVar12._20_4_;
      fVar323 = auVar177._20_4_;
      fVar255 = auVar12._24_4_;
      fVar324 = auVar177._24_4_;
      fVar173 = auVar179._0_4_;
      fVar325 = auVar126._0_4_;
      fVar175 = auVar179._4_4_;
      fVar384 = auVar126._4_4_;
      fVar197 = auVar179._8_4_;
      fVar386 = auVar126._8_4_;
      fVar209 = auVar179._12_4_;
      fVar330 = auVar126._12_4_;
      fVar226 = auVar179._16_4_;
      fVar331 = auVar126._16_4_;
      fVar238 = auVar179._20_4_;
      fVar332 = auVar126._20_4_;
      fVar256 = auVar179._24_4_;
      fVar333 = auVar126._24_4_;
      fVar344 = auVar296._0_4_;
      fVar335 = auVar125._0_4_;
      fVar348 = auVar296._4_4_;
      fVar345 = auVar125._4_4_;
      fVar198 = auVar296._8_4_;
      fVar347 = auVar125._8_4_;
      fVar210 = auVar296._12_4_;
      fVar349 = auVar125._12_4_;
      fVar227 = auVar296._16_4_;
      fVar350 = auVar125._16_4_;
      fVar239 = auVar296._20_4_;
      fVar351 = auVar125._20_4_;
      fVar257 = auVar296._24_4_;
      fVar352 = auVar125._24_4_;
      fVar258 = auVar16._28_4_;
      fVar385 = fVar258 + auVar15._28_4_;
      auVar354._0_4_ = fVar335 * fVar344 + fVar325 * fVar173 + fVar287 * fVar334 + fVar263 * fVar115
      ;
      auVar354._4_4_ = fVar345 * fVar348 + fVar384 * fVar175 + fVar311 * fVar346 + fVar264 * fVar174
      ;
      auVar354._8_4_ = fVar347 * fVar198 + fVar386 * fVar197 + fVar312 * fVar196 + fVar265 * fVar176
      ;
      auVar354._12_4_ =
           fVar349 * fVar210 + fVar330 * fVar209 + fVar313 * fVar208 + fVar266 * fVar199;
      auVar354._16_4_ =
           fVar350 * fVar227 + fVar331 * fVar226 + fVar314 * fVar225 + fVar282 * fVar211;
      auVar354._20_4_ =
           fVar351 * fVar239 + fVar332 * fVar238 + fVar323 * fVar237 + fVar283 * fVar228;
      auVar354._24_4_ =
           fVar352 * fVar257 + fVar333 * fVar256 + fVar324 * fVar255 + fVar284 * fVar240;
      auVar354._28_4_ = fVar385 + auVar14._28_4_ + auVar10._28_4_;
      auVar9._4_4_ = fVar311 * fVar174;
      auVar9._0_4_ = fVar287 * fVar115;
      auVar9._8_4_ = fVar312 * fVar176;
      auVar9._12_4_ = fVar313 * fVar199;
      auVar9._16_4_ = fVar314 * fVar211;
      auVar9._20_4_ = fVar323 * fVar228;
      auVar9._24_4_ = fVar324 * fVar240;
      auVar9._28_4_ = auVar14._28_4_;
      auVar371._0_4_ = fVar263 * fVar173 + fVar335 * fVar334;
      auVar371._4_4_ = fVar264 * fVar175 + fVar345 * fVar346;
      auVar371._8_4_ = fVar265 * fVar197 + fVar347 * fVar196;
      auVar371._12_4_ = fVar266 * fVar209 + fVar349 * fVar208;
      auVar371._16_4_ = fVar282 * fVar226 + fVar350 * fVar225;
      auVar371._20_4_ = fVar283 * fVar238 + fVar351 * fVar237;
      auVar371._24_4_ = fVar284 * fVar256 + fVar352 * fVar255;
      auVar371._28_4_ = fVar258 + fVar385;
      auVar9 = vsubps_avx(auVar9,auVar371);
      auVar10._4_4_ = fVar384 * fVar348;
      auVar10._0_4_ = fVar325 * fVar344;
      auVar10._8_4_ = fVar386 * fVar198;
      auVar10._12_4_ = fVar330 * fVar210;
      auVar10._16_4_ = fVar331 * fVar227;
      auVar10._20_4_ = fVar332 * fVar239;
      auVar10._24_4_ = fVar333 * fVar257;
      auVar10._28_4_ = fVar258;
      auVar9 = vsubps_avx(auVar9,auVar10);
      auVar14._4_4_ = fVar384 * fVar174;
      auVar14._0_4_ = fVar325 * fVar115;
      auVar14._8_4_ = fVar386 * fVar176;
      auVar14._12_4_ = fVar330 * fVar199;
      auVar14._16_4_ = fVar331 * fVar211;
      auVar14._20_4_ = fVar332 * fVar228;
      auVar14._24_4_ = fVar333 * fVar240;
      auVar14._28_4_ = auVar371._28_4_;
      auVar15._4_4_ = fVar264 * fVar346;
      auVar15._0_4_ = fVar263 * fVar334;
      auVar15._8_4_ = fVar265 * fVar196;
      auVar15._12_4_ = fVar266 * fVar208;
      auVar15._16_4_ = fVar282 * fVar225;
      auVar15._20_4_ = fVar283 * fVar237;
      auVar15._24_4_ = fVar284 * fVar255;
      auVar15._28_4_ = fVar258;
      auVar10 = vsubps_avx(auVar14,auVar15);
      auVar372._0_4_ = auVar10._0_4_ + fVar335 * fVar173 + fVar287 * fVar344;
      auVar372._4_4_ = auVar10._4_4_ + fVar345 * fVar175 + fVar311 * fVar348;
      auVar372._8_4_ = auVar10._8_4_ + fVar347 * fVar197 + fVar312 * fVar198;
      auVar372._12_4_ = auVar10._12_4_ + fVar349 * fVar209 + fVar313 * fVar210;
      auVar372._16_4_ = auVar10._16_4_ + fVar350 * fVar226 + fVar314 * fVar227;
      auVar372._20_4_ = auVar10._20_4_ + fVar351 * fVar238 + fVar323 * fVar239;
      auVar372._24_4_ = auVar10._24_4_ + fVar352 * fVar256 + fVar324 * fVar257;
      auVar372._28_4_ = auVar10._28_4_ + fVar258 + fVar258;
      auVar388._0_4_ = fVar335 * fVar115 + fVar287 * fVar173;
      auVar388._4_4_ = fVar345 * fVar174 + fVar311 * fVar175;
      auVar388._8_4_ = fVar347 * fVar176 + fVar312 * fVar197;
      auVar388._12_4_ = fVar349 * fVar199 + fVar313 * fVar209;
      auVar388._16_4_ = fVar350 * fVar211 + fVar314 * fVar226;
      auVar388._20_4_ = fVar351 * fVar228 + fVar323 * fVar238;
      auVar388._24_4_ = fVar352 * fVar240 + fVar324 * fVar256;
      auVar388._28_4_ = fVar258 + auVar179._28_4_;
      auVar222._0_4_ = fVar263 * fVar344 + fVar325 * fVar334;
      auVar222._4_4_ = fVar264 * fVar348 + fVar384 * fVar346;
      auVar222._8_4_ = fVar265 * fVar198 + fVar386 * fVar196;
      auVar222._12_4_ = fVar266 * fVar210 + fVar330 * fVar208;
      auVar222._16_4_ = fVar282 * fVar227 + fVar331 * fVar225;
      auVar222._20_4_ = fVar283 * fVar239 + fVar332 * fVar237;
      auVar222._24_4_ = fVar284 * fVar257 + fVar333 * fVar255;
      auVar222._28_4_ = auVar296._28_4_ + auVar12._28_4_;
      auVar10 = vsubps_avx(auVar388,auVar222);
      auVar91._4_4_ = fStack_d4;
      auVar91._0_4_ = fStack_d8;
      auVar91._8_4_ = local_d0;
      auVar91._12_4_ = fStack_cc;
      auVar179._16_16_ = auVar91;
      auVar179._0_16_ = auVar91;
      auVar12 = vpermilps_avx(auVar179,0xff);
      auVar14 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0);
      fVar348 = auVar13._0_4_ * auVar179._0_4_;
      fVar176 = auVar13._4_4_ * auVar179._4_4_;
      auVar16._4_4_ = fVar176;
      auVar16._0_4_ = fVar348;
      fVar196 = auVar13._8_4_ * auVar179._8_4_;
      auVar16._8_4_ = fVar196;
      fVar197 = auVar13._12_4_ * auVar179._12_4_;
      auVar16._12_4_ = fVar197;
      fVar198 = auVar13._16_4_ * auVar179._16_4_;
      auVar16._16_4_ = fVar198;
      fVar199 = auVar13._20_4_ * auVar179._20_4_;
      auVar16._20_4_ = fVar199;
      fVar208 = auVar13._24_4_ * auVar179._24_4_;
      auVar16._24_4_ = fVar208;
      auVar16._28_4_ = auVar125._28_4_;
      fVar115 = auVar11._0_4_ * auVar179._0_4_;
      fVar334 = auVar11._4_4_ * auVar179._4_4_;
      auVar13._4_4_ = fVar334;
      auVar13._0_4_ = fVar115;
      fVar173 = auVar11._8_4_ * auVar179._8_4_;
      auVar13._8_4_ = fVar173;
      fVar344 = auVar11._12_4_ * auVar179._12_4_;
      auVar13._12_4_ = fVar344;
      fVar174 = auVar11._16_4_ * auVar179._16_4_;
      auVar13._16_4_ = fVar174;
      fVar346 = auVar11._20_4_ * auVar179._20_4_;
      auVar13._20_4_ = fVar346;
      fVar175 = auVar11._24_4_ * auVar179._24_4_;
      auVar13._24_4_ = fVar175;
      auVar13._28_4_ = auVar11._28_4_;
      auVar337._0_4_ = fVar348 + fVar115;
      auVar337._4_4_ = fVar176 + fVar334;
      auVar337._8_4_ = fVar196 + fVar173;
      auVar337._12_4_ = fVar197 + fVar344;
      auVar337._16_4_ = fVar198 + fVar174;
      auVar337._20_4_ = fVar199 + fVar346;
      auVar337._24_4_ = fVar208 + fVar175;
      auVar337._28_4_ = auVar125._28_4_ + auVar11._28_4_;
      auVar179 = vsubps_avx(auVar16,auVar13);
      auVar268._0_4_ = auVar221._0_4_ * auVar12._0_4_ + auVar178._0_4_ * auVar14._0_4_;
      auVar268._4_4_ = auVar221._4_4_ * auVar12._4_4_ + auVar178._4_4_ * auVar14._4_4_;
      auVar268._8_4_ = auVar221._8_4_ * auVar12._8_4_ + auVar178._8_4_ * auVar14._8_4_;
      auVar268._12_4_ = auVar221._12_4_ * auVar12._12_4_ + auVar178._12_4_ * auVar14._12_4_;
      auVar268._16_4_ = auVar221._16_4_ * auVar12._16_4_ + auVar178._16_4_ * auVar14._16_4_;
      auVar268._20_4_ = auVar221._20_4_ * auVar12._20_4_ + auVar178._20_4_ * auVar14._20_4_;
      auVar268._24_4_ = auVar221._24_4_ * auVar12._24_4_ + auVar178._24_4_ * auVar14._24_4_;
      auVar268._28_4_ = auVar177._28_4_ + auVar296._28_4_;
      auVar298._0_4_ = auVar337._0_4_ + auVar268._0_4_;
      auVar298._4_4_ = auVar337._4_4_ + auVar268._4_4_;
      auVar298._8_4_ = auVar337._8_4_ + auVar268._8_4_;
      auVar298._12_4_ = auVar337._12_4_ + auVar268._12_4_;
      auVar298._16_4_ = auVar337._16_4_ + auVar268._16_4_;
      auVar298._20_4_ = auVar337._20_4_ + auVar268._20_4_;
      auVar298._24_4_ = auVar337._24_4_ + auVar268._24_4_;
      auVar298._28_4_ = auVar337._28_4_ + auVar268._28_4_;
      auVar296 = vsubps_avx(auVar337,auVar268);
      auVar11._4_4_ = auVar178._4_4_ * auVar12._4_4_;
      auVar11._0_4_ = auVar178._0_4_ * auVar12._0_4_;
      auVar11._8_4_ = auVar178._8_4_ * auVar12._8_4_;
      auVar11._12_4_ = auVar178._12_4_ * auVar12._12_4_;
      auVar11._16_4_ = auVar178._16_4_ * auVar12._16_4_;
      auVar11._20_4_ = auVar178._20_4_ * auVar12._20_4_;
      auVar11._24_4_ = auVar178._24_4_ * auVar12._24_4_;
      auVar11._28_4_ = auVar268._28_4_;
      auVar12._4_4_ = auVar221._4_4_ * auVar14._4_4_;
      auVar12._0_4_ = auVar221._0_4_ * auVar14._0_4_;
      auVar12._8_4_ = auVar221._8_4_ * auVar14._8_4_;
      auVar12._12_4_ = auVar221._12_4_ * auVar14._12_4_;
      auVar12._16_4_ = auVar221._16_4_ * auVar14._16_4_;
      auVar12._20_4_ = auVar221._20_4_ * auVar14._20_4_;
      auVar12._24_4_ = auVar221._24_4_ * auVar14._24_4_;
      auVar12._28_4_ = auVar177._28_4_;
      auVar221 = vsubps_avx(auVar11,auVar12);
      auVar316._0_4_ = auVar179._0_4_ + auVar221._0_4_;
      auVar316._4_4_ = auVar179._4_4_ + auVar221._4_4_;
      auVar316._8_4_ = auVar179._8_4_ + auVar221._8_4_;
      auVar316._12_4_ = auVar179._12_4_ + auVar221._12_4_;
      auVar316._16_4_ = auVar179._16_4_ + auVar221._16_4_;
      auVar316._20_4_ = auVar179._20_4_ + auVar221._20_4_;
      auVar316._24_4_ = auVar179._24_4_ + auVar221._24_4_;
      auVar316._28_4_ = auVar179._28_4_ + auVar221._28_4_;
      auVar179 = vsubps_avx(auVar179,auVar221);
      auVar221 = vsubps_avx(auVar298,auVar354);
      auVar11 = vsubps_avx(auVar316,auVar9);
      auVar12 = vsubps_avx(auVar179,auVar372);
      auVar178 = vsubps_avx(auVar296,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar298._0_4_ + auVar354._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar298._4_4_ + auVar354._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar298._8_4_ + auVar354._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar298._12_4_ + auVar354._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar298._16_4_ + auVar354._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar298._20_4_ + auVar354._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar298._24_4_ + auVar354._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar298._28_4_ + auVar354._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar316._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar316._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar316._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar316._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar316._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar316._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar316._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar316._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar179._0_4_ + auVar372._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar179._4_4_ + auVar372._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar179._8_4_ + auVar372._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar179._12_4_ + auVar372._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar179._16_4_ + auVar372._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar179._20_4_ + auVar372._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar179._24_4_ + auVar372._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar179._28_4_ + auVar372._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar296._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar296._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar296._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar296._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar296._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar296._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar296._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar296._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar178;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar221;
      in_ZMM7 = ZEXT1664(auVar221._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"7x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x38) {
          auVar166._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar166._8_56_ = extraout_var_16;
          in_ZMM0._4_60_ = auVar166._4_60_;
          in_ZMM0._0_4_ = (float)auVar166._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar373._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar373._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar389._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar389._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar373,auVar389);
      auVar9 = vunpckhpd_avx(auVar373,auVar389);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar221 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar355._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar355._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar365._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar365._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar179 = vunpcklpd_avx(auVar355,auVar365);
      auVar10 = vunpckhpd_avx(auVar355,auVar365);
      auVar296 = vunpcklps_avx(auVar179,auVar10);
      auVar10 = vunpckhps_avx(auVar179,auVar10);
      auVar11 = vunpcklpd_avx(auVar296,auVar10);
      auVar10 = vunpckhpd_avx(auVar296,auVar10);
      auVar327._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar327._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar338._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar338._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar296 = vunpcklpd_avx(auVar327,auVar338);
      auVar179 = vunpckhpd_avx(auVar327,auVar338);
      auVar178 = vunpcklps_avx(auVar296,auVar179);
      auVar179 = vunpckhps_avx(auVar296,auVar179);
      auVar12 = vunpcklpd_avx(auVar178,auVar179);
      auVar179 = vunpckhpd_avx(auVar178,auVar179);
      auVar299._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xe0);
      auVar299._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xc0);
      auVar317._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xf0);
      auVar317._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xd0);
      auVar178 = vunpcklpd_avx(auVar299,auVar317);
      auVar296 = vunpckhpd_avx(auVar299,auVar317);
      auVar13 = vunpcklps_avx(auVar178,auVar296);
      auVar296 = vunpckhps_avx(auVar178,auVar296);
      auVar178 = vunpcklpd_avx(auVar13,auVar296);
      auVar296 = vunpckhpd_avx(auVar13,auVar296);
      auVar13 = vpermilps_avx(auVar221,0);
      auVar14 = vpermilps_avx(auVar221,0x55);
      auVar15 = vpermilps_avx(auVar221,0xaa);
      auVar221 = vpermilps_avx(auVar221,0xff);
      auVar127._0_4_ =
           local_e0 * auVar13._0_4_ + local_d0 * auVar14._0_4_ +
           local_c0 * auVar15._0_4_ + local_b0 * auVar221._0_4_;
      auVar127._4_4_ =
           fStack_dc * auVar13._4_4_ + fStack_cc * auVar14._4_4_ +
           fStack_bc * auVar15._4_4_ + fStack_ac * auVar221._4_4_;
      auVar127._8_4_ =
           fStack_d8 * auVar13._8_4_ + fStack_c8 * auVar14._8_4_ +
           fStack_b8 * auVar15._8_4_ + fStack_a8 * auVar221._8_4_;
      auVar127._12_4_ =
           fStack_d4 * auVar13._12_4_ + fStack_c4 * auVar14._12_4_ +
           fStack_b4 * auVar15._12_4_ + fStack_a4 * auVar221._12_4_;
      auVar127._16_4_ =
           local_e0 * auVar13._16_4_ + local_d0 * auVar14._16_4_ +
           local_c0 * auVar15._16_4_ + local_b0 * auVar221._16_4_;
      auVar127._20_4_ =
           fStack_dc * auVar13._20_4_ + fStack_cc * auVar14._20_4_ +
           fStack_bc * auVar15._20_4_ + fStack_ac * auVar221._20_4_;
      auVar127._24_4_ =
           fStack_d8 * auVar13._24_4_ + fStack_c8 * auVar14._24_4_ +
           fStack_b8 * auVar15._24_4_ + fStack_a8 * auVar221._24_4_;
      auVar127._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar221._28_4_;
      auVar221 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar180._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar13._0_4_ +
           local_c0 * auVar14._0_4_ + local_b0 * auVar11._0_4_;
      auVar180._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar13._4_4_ +
           fStack_bc * auVar14._4_4_ + fStack_ac * auVar11._4_4_;
      auVar180._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar13._8_4_ +
           fStack_b8 * auVar14._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar180._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar13._12_4_ +
           fStack_b4 * auVar14._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar180._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar13._16_4_ +
           local_c0 * auVar14._16_4_ + local_b0 * auVar11._16_4_;
      auVar180._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar13._20_4_ +
           fStack_bc * auVar14._20_4_ + fStack_ac * auVar11._20_4_;
      auVar180._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar13._24_4_ +
           fStack_b8 * auVar14._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar180._28_4_ = auVar221._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar221 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar202._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar12._0_4_;
      auVar202._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar12._4_4_;
      auVar202._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar12._8_4_;
      auVar202._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar12._12_4_;
      auVar202._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar12._16_4_;
      auVar202._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar12._20_4_;
      auVar202._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar12._24_4_;
      auVar202._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar221 = vpermilps_avx(auVar178,0);
      auVar11 = vpermilps_avx(auVar178,0x55);
      auVar12 = vpermilps_avx(auVar178,0xaa);
      auVar178 = vpermilps_avx(auVar178,0xff);
      auVar223._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar178._0_4_;
      auVar223._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar178._4_4_;
      auVar223._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar178._8_4_;
      auVar223._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar178._12_4_;
      auVar223._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar178._16_4_;
      auVar223._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar178._20_4_;
      auVar223._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar178._24_4_;
      auVar223._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar178._28_4_;
      auVar99._4_4_ = fStack_9c;
      auVar99._0_4_ = local_a0;
      auVar99._8_4_ = fStack_98;
      auVar99._12_4_ = fStack_94;
      auVar300._16_16_ = auVar99;
      auVar300._0_16_ = auVar99;
      auVar221 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar230._0_4_ =
           local_a0 * auVar221._0_4_ + local_90 * auVar11._0_4_ +
           local_80 * auVar12._0_4_ + local_70 * auVar9._0_4_;
      auVar230._4_4_ =
           fStack_9c * auVar221._4_4_ + fStack_8c * auVar11._4_4_ +
           fStack_7c * auVar12._4_4_ + fStack_6c * auVar9._4_4_;
      auVar230._8_4_ =
           fStack_98 * auVar221._8_4_ + fStack_88 * auVar11._8_4_ +
           fStack_78 * auVar12._8_4_ + fStack_68 * auVar9._8_4_;
      auVar230._12_4_ =
           fStack_94 * auVar221._12_4_ + fStack_84 * auVar11._12_4_ +
           fStack_74 * auVar12._12_4_ + fStack_64 * auVar9._12_4_;
      auVar230._16_4_ =
           local_a0 * auVar221._16_4_ + local_90 * auVar11._16_4_ +
           local_80 * auVar12._16_4_ + local_70 * auVar9._16_4_;
      auVar230._20_4_ =
           fStack_9c * auVar221._20_4_ + fStack_8c * auVar11._20_4_ +
           fStack_7c * auVar12._20_4_ + fStack_6c * auVar9._20_4_;
      auVar230._24_4_ =
           fStack_98 * auVar221._24_4_ + fStack_88 * auVar11._24_4_ +
           fStack_78 * auVar12._24_4_ + fStack_68 * auVar9._24_4_;
      auVar230._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar221 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar250._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar221._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar10._0_4_;
      auVar250._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar221._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar10._4_4_;
      auVar250._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar221._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar10._8_4_;
      auVar250._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar221._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar10._12_4_;
      auVar250._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar221._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar10._16_4_;
      auVar250._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar221._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar10._20_4_;
      auVar250._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar221._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar10._24_4_;
      auVar250._28_4_ = auVar9._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar179,0);
      auVar10 = vpermilps_avx(auVar179,0x55);
      auVar221 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar260._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar179._0_4_;
      auVar260._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar179._4_4_;
      auVar260._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar179._8_4_;
      auVar260._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar179._12_4_;
      auVar260._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar179._16_4_;
      auVar260._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar179._20_4_;
      auVar260._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar179._24_4_;
      auVar260._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar221._28_4_ + auVar179._28_4_;
      auVar9 = vpermilps_avx(auVar296,0);
      auVar10 = vpermilps_avx(auVar296,0x55);
      auVar179 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar269._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar179._0_4_ + local_70 * auVar296._0_4_;
      auVar269._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar179._4_4_ + fStack_6c * auVar296._4_4_;
      auVar269._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar179._8_4_ + fStack_68 * auVar296._8_4_;
      auVar269._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar179._12_4_ + fStack_64 * auVar296._12_4_;
      auVar269._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar179._16_4_ + local_70 * auVar296._16_4_;
      auVar269._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar179._20_4_ + fStack_6c * auVar296._20_4_;
      auVar269._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar179._24_4_ + fStack_68 * auVar296._24_4_;
      auVar269._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar179._28_4_ + auVar296._28_4_;
      auVar9 = vsubps_avx(auVar127,auVar230);
      auVar128._0_4_ = auVar127._0_4_ + auVar230._0_4_;
      auVar128._4_4_ = auVar127._4_4_ + auVar230._4_4_;
      auVar128._8_4_ = auVar127._8_4_ + auVar230._8_4_;
      auVar128._12_4_ = auVar127._12_4_ + auVar230._12_4_;
      auVar128._16_4_ = auVar127._16_4_ + auVar230._16_4_;
      auVar128._20_4_ = auVar127._20_4_ + auVar230._20_4_;
      auVar128._24_4_ = auVar127._24_4_ + auVar230._24_4_;
      auVar128._28_4_ = auVar127._28_4_ + auVar230._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar180,auVar250);
      auVar181._0_4_ = auVar180._0_4_ + auVar250._0_4_;
      auVar181._4_4_ = auVar180._4_4_ + auVar250._4_4_;
      auVar181._8_4_ = auVar180._8_4_ + auVar250._8_4_;
      auVar181._12_4_ = auVar180._12_4_ + auVar250._12_4_;
      auVar181._16_4_ = auVar180._16_4_ + auVar250._16_4_;
      auVar181._20_4_ = auVar180._20_4_ + auVar250._20_4_;
      auVar181._24_4_ = auVar180._24_4_ + auVar250._24_4_;
      auVar181._28_4_ = auVar180._28_4_ + auVar250._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar202,auVar260);
      auVar203._0_4_ = auVar202._0_4_ + auVar260._0_4_;
      auVar203._4_4_ = auVar202._4_4_ + auVar260._4_4_;
      auVar203._8_4_ = auVar202._8_4_ + auVar260._8_4_;
      auVar203._12_4_ = auVar202._12_4_ + auVar260._12_4_;
      auVar203._16_4_ = auVar202._16_4_ + auVar260._16_4_;
      auVar203._20_4_ = auVar202._20_4_ + auVar260._20_4_;
      auVar203._24_4_ = auVar202._24_4_ + auVar260._24_4_;
      auVar203._28_4_ = auVar202._28_4_ + auVar260._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar223,auVar269);
      auVar224._0_4_ = auVar223._0_4_ + auVar269._0_4_;
      auVar224._4_4_ = auVar223._4_4_ + auVar269._4_4_;
      auVar224._8_4_ = auVar223._8_4_ + auVar269._8_4_;
      auVar224._12_4_ = auVar223._12_4_ + auVar269._12_4_;
      auVar224._16_4_ = auVar223._16_4_ + auVar269._16_4_;
      auVar224._20_4_ = auVar223._20_4_ + auVar269._20_4_;
      auVar224._24_4_ = auVar223._24_4_ + auVar269._24_4_;
      auVar224._28_4_ = auVar223._28_4_ + auVar269._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar221 = vperm2f128_avx(auVar15,auVar224,2);
      auVar179 = vperm2f128_avx(auVar14,auVar203,0x13);
      auVar296 = vperm2f128_avx(auVar14,auVar203,2);
      auVar11 = vperm2f128_avx(auVar13,auVar181,0x13);
      auVar12 = vperm2f128_avx(auVar13,auVar181,2);
      auVar9 = vperm2f128_avx(auVar10,auVar128,0x13);
      auVar178 = vperm2f128_avx(auVar10,auVar128,2);
      auVar16 = vpermilps_avx(auVar300,0xff);
      auVar125 = vpermilps_avx(auVar300,0xaa);
      auVar126 = vpermilps_avx(auVar300,0x55);
      auVar177 = vpermilps_avx(auVar300,0);
      fVar115 = auVar9._0_4_;
      fVar238 = auVar177._0_4_;
      fVar344 = auVar9._4_4_;
      fVar239 = auVar177._4_4_;
      fVar175 = auVar9._8_4_;
      fVar240 = auVar177._8_4_;
      fVar196 = auVar9._12_4_;
      fVar255 = auVar177._12_4_;
      fVar199 = auVar9._16_4_;
      fVar256 = auVar177._16_4_;
      fVar210 = auVar9._20_4_;
      fVar257 = auVar177._20_4_;
      fVar226 = auVar9._24_4_;
      fVar258 = auVar177._24_4_;
      fVar334 = auVar11._0_4_;
      fVar263 = auVar126._0_4_;
      fVar174 = auVar11._4_4_;
      fVar264 = auVar126._4_4_;
      fVar348 = auVar11._8_4_;
      fVar265 = auVar126._8_4_;
      fVar197 = auVar11._12_4_;
      fVar266 = auVar126._12_4_;
      fVar208 = auVar11._16_4_;
      fVar282 = auVar126._16_4_;
      fVar211 = auVar11._20_4_;
      fVar283 = auVar126._20_4_;
      fVar227 = auVar11._24_4_;
      fVar284 = auVar126._24_4_;
      fVar173 = auVar179._0_4_;
      fVar287 = auVar125._0_4_;
      fVar346 = auVar179._4_4_;
      fVar311 = auVar125._4_4_;
      fVar176 = auVar179._8_4_;
      fVar312 = auVar125._8_4_;
      fVar198 = auVar179._12_4_;
      fVar313 = auVar125._12_4_;
      fVar209 = auVar179._16_4_;
      fVar314 = auVar125._16_4_;
      fVar225 = auVar179._20_4_;
      fVar323 = auVar125._20_4_;
      fVar228 = auVar179._24_4_;
      fVar324 = auVar125._24_4_;
      auVar356._0_4_ = fVar287 * fVar173 + fVar263 * fVar334 + fVar238 * fVar115;
      auVar356._4_4_ = fVar311 * fVar346 + fVar264 * fVar174 + fVar239 * fVar344;
      auVar356._8_4_ = fVar312 * fVar176 + fVar265 * fVar348 + fVar240 * fVar175;
      auVar356._12_4_ = fVar313 * fVar198 + fVar266 * fVar197 + fVar255 * fVar196;
      auVar356._16_4_ = fVar314 * fVar209 + fVar282 * fVar208 + fVar256 * fVar199;
      auVar356._20_4_ = fVar323 * fVar225 + fVar283 * fVar211 + fVar257 * fVar210;
      auVar356._24_4_ = fVar324 * fVar228 + fVar284 * fVar227 + fVar258 * fVar226;
      auVar356._28_4_ = auVar14._28_4_ + auVar13._28_4_ + auVar10._28_4_;
      auVar17._4_4_ = fVar264 * fVar344;
      auVar17._0_4_ = fVar263 * fVar115;
      auVar17._8_4_ = fVar265 * fVar175;
      auVar17._12_4_ = fVar266 * fVar196;
      auVar17._16_4_ = fVar282 * fVar199;
      auVar17._20_4_ = fVar283 * fVar210;
      auVar17._24_4_ = fVar284 * fVar226;
      auVar17._28_4_ = auVar13._28_4_;
      fVar325 = auVar16._0_4_;
      fVar384 = auVar16._4_4_;
      fVar386 = auVar16._8_4_;
      fVar330 = auVar16._12_4_;
      fVar331 = auVar16._16_4_;
      fVar332 = auVar16._20_4_;
      fVar333 = auVar16._24_4_;
      fVar237 = auVar15._28_4_;
      auVar374._0_4_ = fVar238 * fVar173 + fVar325 * fVar334;
      auVar374._4_4_ = fVar239 * fVar346 + fVar384 * fVar174;
      auVar374._8_4_ = fVar240 * fVar176 + fVar386 * fVar348;
      auVar374._12_4_ = fVar255 * fVar198 + fVar330 * fVar197;
      auVar374._16_4_ = fVar256 * fVar209 + fVar331 * fVar208;
      auVar374._20_4_ = fVar257 * fVar225 + fVar332 * fVar211;
      auVar374._24_4_ = fVar258 * fVar228 + fVar333 * fVar227;
      auVar374._28_4_ = fVar237 + auVar14._28_4_;
      auVar9 = vsubps_avx(auVar17,auVar374);
      auVar18._4_4_ = fVar311 * fVar344;
      auVar18._0_4_ = fVar287 * fVar115;
      auVar18._8_4_ = fVar312 * fVar175;
      auVar18._12_4_ = fVar313 * fVar196;
      auVar18._16_4_ = fVar314 * fVar199;
      auVar18._20_4_ = fVar323 * fVar210;
      auVar18._24_4_ = fVar324 * fVar226;
      auVar18._28_4_ = auVar374._28_4_;
      auVar19._4_4_ = fVar239 * fVar174;
      auVar19._0_4_ = fVar238 * fVar334;
      auVar19._8_4_ = fVar240 * fVar348;
      auVar19._12_4_ = fVar255 * fVar197;
      auVar19._16_4_ = fVar256 * fVar208;
      auVar19._20_4_ = fVar257 * fVar211;
      auVar19._24_4_ = fVar258 * fVar227;
      auVar19._28_4_ = fVar237;
      auVar10 = vsubps_avx(auVar18,auVar19);
      auVar375._0_4_ = auVar10._0_4_ + fVar325 * fVar173;
      auVar375._4_4_ = auVar10._4_4_ + fVar384 * fVar346;
      auVar375._8_4_ = auVar10._8_4_ + fVar386 * fVar176;
      auVar375._12_4_ = auVar10._12_4_ + fVar330 * fVar198;
      auVar375._16_4_ = auVar10._16_4_ + fVar331 * fVar209;
      auVar375._20_4_ = auVar10._20_4_ + fVar332 * fVar225;
      auVar375._24_4_ = auVar10._24_4_ + fVar333 * fVar228;
      auVar375._28_4_ = auVar10._28_4_ + fVar237;
      auVar20._4_4_ = fVar311 * fVar174;
      auVar20._0_4_ = fVar287 * fVar334;
      auVar20._8_4_ = fVar312 * fVar348;
      auVar20._12_4_ = fVar313 * fVar197;
      auVar20._16_4_ = fVar314 * fVar208;
      auVar20._20_4_ = fVar323 * fVar211;
      auVar20._24_4_ = fVar324 * fVar227;
      auVar20._28_4_ = auVar11._28_4_;
      auVar390._0_4_ = fVar325 * fVar115 + fVar263 * fVar173;
      auVar390._4_4_ = fVar384 * fVar344 + fVar264 * fVar346;
      auVar390._8_4_ = fVar386 * fVar175 + fVar265 * fVar176;
      auVar390._12_4_ = fVar330 * fVar196 + fVar266 * fVar198;
      auVar390._16_4_ = fVar331 * fVar199 + fVar282 * fVar209;
      auVar390._20_4_ = fVar332 * fVar210 + fVar283 * fVar225;
      auVar390._24_4_ = fVar333 * fVar226 + fVar284 * fVar228;
      auVar390._28_4_ = fVar237 + auVar179._28_4_;
      auVar10 = vsubps_avx(auVar390,auVar20);
      auVar92._4_4_ = fStack_d4;
      auVar92._0_4_ = fStack_d8;
      auVar92._8_4_ = local_d0;
      auVar92._12_4_ = fStack_cc;
      auVar182._16_16_ = auVar92;
      auVar182._0_16_ = auVar92;
      auVar11 = vpermilps_avx(auVar182,0xff);
      auVar13 = vpermilps_avx(auVar182,0xaa);
      auVar179 = vpermilps_avx(auVar182,0);
      fVar348 = auVar178._0_4_ * auVar179._0_4_;
      fVar176 = auVar178._4_4_ * auVar179._4_4_;
      auVar21._4_4_ = fVar176;
      auVar21._0_4_ = fVar348;
      fVar196 = auVar178._8_4_ * auVar179._8_4_;
      auVar21._8_4_ = fVar196;
      fVar197 = auVar178._12_4_ * auVar179._12_4_;
      auVar21._12_4_ = fVar197;
      fVar198 = auVar178._16_4_ * auVar179._16_4_;
      auVar21._16_4_ = fVar198;
      fVar199 = auVar178._20_4_ * auVar179._20_4_;
      auVar21._20_4_ = fVar199;
      fVar208 = auVar178._24_4_ * auVar179._24_4_;
      auVar21._24_4_ = fVar208;
      auVar21._28_4_ = auVar16._28_4_;
      fVar115 = auVar296._0_4_ * auVar179._0_4_;
      fVar334 = auVar296._4_4_ * auVar179._4_4_;
      auVar22._4_4_ = fVar334;
      auVar22._0_4_ = fVar115;
      fVar173 = auVar296._8_4_ * auVar179._8_4_;
      auVar22._8_4_ = fVar173;
      fVar344 = auVar296._12_4_ * auVar179._12_4_;
      auVar22._12_4_ = fVar344;
      fVar174 = auVar296._16_4_ * auVar179._16_4_;
      auVar22._16_4_ = fVar174;
      fVar346 = auVar296._20_4_ * auVar179._20_4_;
      auVar22._20_4_ = fVar346;
      fVar175 = auVar296._24_4_ * auVar179._24_4_;
      auVar22._24_4_ = fVar175;
      auVar22._28_4_ = auVar296._28_4_;
      auVar339._0_4_ = fVar348 + fVar115;
      auVar339._4_4_ = fVar176 + fVar334;
      auVar339._8_4_ = fVar196 + fVar173;
      auVar339._12_4_ = fVar197 + fVar344;
      auVar339._16_4_ = fVar198 + fVar174;
      auVar339._20_4_ = fVar199 + fVar346;
      auVar339._24_4_ = fVar208 + fVar175;
      auVar339._28_4_ = auVar16._28_4_ + auVar296._28_4_;
      auVar179 = vsubps_avx(auVar21,auVar22);
      auVar270._0_4_ = auVar221._0_4_ * auVar11._0_4_ + auVar12._0_4_ * auVar13._0_4_;
      auVar270._4_4_ = auVar221._4_4_ * auVar11._4_4_ + auVar12._4_4_ * auVar13._4_4_;
      auVar270._8_4_ = auVar221._8_4_ * auVar11._8_4_ + auVar12._8_4_ * auVar13._8_4_;
      auVar270._12_4_ = auVar221._12_4_ * auVar11._12_4_ + auVar12._12_4_ * auVar13._12_4_;
      auVar270._16_4_ = auVar221._16_4_ * auVar11._16_4_ + auVar12._16_4_ * auVar13._16_4_;
      auVar270._20_4_ = auVar221._20_4_ * auVar11._20_4_ + auVar12._20_4_ * auVar13._20_4_;
      auVar270._24_4_ = auVar221._24_4_ * auVar11._24_4_ + auVar12._24_4_ * auVar13._24_4_;
      auVar270._28_4_ = auVar126._28_4_ + auVar269._28_4_;
      auVar301._0_4_ = auVar339._0_4_ + auVar270._0_4_;
      auVar301._4_4_ = auVar339._4_4_ + auVar270._4_4_;
      auVar301._8_4_ = auVar339._8_4_ + auVar270._8_4_;
      auVar301._12_4_ = auVar339._12_4_ + auVar270._12_4_;
      auVar301._16_4_ = auVar339._16_4_ + auVar270._16_4_;
      auVar301._20_4_ = auVar339._20_4_ + auVar270._20_4_;
      auVar301._24_4_ = auVar339._24_4_ + auVar270._24_4_;
      auVar301._28_4_ = auVar339._28_4_ + auVar270._28_4_;
      auVar296 = vsubps_avx(auVar339,auVar270);
      auVar23._4_4_ = auVar12._4_4_ * auVar11._4_4_;
      auVar23._0_4_ = auVar12._0_4_ * auVar11._0_4_;
      auVar23._8_4_ = auVar12._8_4_ * auVar11._8_4_;
      auVar23._12_4_ = auVar12._12_4_ * auVar11._12_4_;
      auVar23._16_4_ = auVar12._16_4_ * auVar11._16_4_;
      auVar23._20_4_ = auVar12._20_4_ * auVar11._20_4_;
      auVar23._24_4_ = auVar12._24_4_ * auVar11._24_4_;
      auVar23._28_4_ = auVar270._28_4_;
      auVar24._4_4_ = auVar221._4_4_ * auVar13._4_4_;
      auVar24._0_4_ = auVar221._0_4_ * auVar13._0_4_;
      auVar24._8_4_ = auVar221._8_4_ * auVar13._8_4_;
      auVar24._12_4_ = auVar221._12_4_ * auVar13._12_4_;
      auVar24._16_4_ = auVar221._16_4_ * auVar13._16_4_;
      auVar24._20_4_ = auVar221._20_4_ * auVar13._20_4_;
      auVar24._24_4_ = auVar221._24_4_ * auVar13._24_4_;
      auVar24._28_4_ = auVar126._28_4_;
      auVar221 = vsubps_avx(auVar23,auVar24);
      auVar318._0_4_ = auVar179._0_4_ + auVar221._0_4_;
      auVar318._4_4_ = auVar179._4_4_ + auVar221._4_4_;
      auVar318._8_4_ = auVar179._8_4_ + auVar221._8_4_;
      auVar318._12_4_ = auVar179._12_4_ + auVar221._12_4_;
      auVar318._16_4_ = auVar179._16_4_ + auVar221._16_4_;
      auVar318._20_4_ = auVar179._20_4_ + auVar221._20_4_;
      auVar318._24_4_ = auVar179._24_4_ + auVar221._24_4_;
      auVar318._28_4_ = auVar179._28_4_ + auVar221._28_4_;
      auVar179 = vsubps_avx(auVar179,auVar221);
      auVar221 = vsubps_avx(auVar301,auVar356);
      auVar11 = vsubps_avx(auVar318,auVar9);
      auVar12 = vsubps_avx(auVar179,auVar375);
      auVar178 = vsubps_avx(auVar296,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar301._0_4_ + auVar356._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar301._4_4_ + auVar356._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar301._8_4_ + auVar356._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar301._12_4_ + auVar356._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar301._16_4_ + auVar356._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar301._20_4_ + auVar356._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar301._24_4_ + auVar356._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar301._28_4_ + auVar356._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar318._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar318._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar318._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar318._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar318._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar318._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar318._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar318._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar179._0_4_ + auVar375._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar179._4_4_ + auVar375._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar179._8_4_ + auVar375._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar179._12_4_ + auVar375._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar179._16_4_ + auVar375._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar179._20_4_ + auVar375._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar179._24_4_ + auVar375._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar179._28_4_ + auVar375._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar296._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar296._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar296._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar296._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar296._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar296._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar296._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar296._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar178;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar221;
      in_ZMM7 = ZEXT1664(auVar221._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"6x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar286 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x30) {
          auVar167._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar167._8_56_ = extraout_var_17;
          in_ZMM0._4_60_ = auVar167._4_60_;
          in_ZMM0._0_4_ = (float)auVar167._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar376._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar376._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar391._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar391._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar376,auVar391);
      auVar9 = vunpckhpd_avx(auVar376,auVar391);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar296 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar357._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar357._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar366._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar366._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar179 = vunpcklpd_avx(auVar357,auVar366);
      auVar10 = vunpckhpd_avx(auVar357,auVar366);
      auVar11 = vunpcklps_avx(auVar179,auVar10);
      auVar10 = vunpckhps_avx(auVar179,auVar10);
      auVar221 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar328._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar328._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar340._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar340._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar328,auVar340);
      auVar179 = vunpckhpd_avx(auVar328,auVar340);
      auVar12 = vunpcklps_avx(auVar11,auVar179);
      auVar179 = vunpckhps_avx(auVar11,auVar179);
      auVar11 = vunpcklpd_avx(auVar12,auVar179);
      auVar179 = vunpckhpd_avx(auVar12,auVar179);
      auVar12 = vpermilps_avx(auVar296,0);
      auVar178 = vpermilps_avx(auVar296,0x55);
      auVar13 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar129._0_4_ =
           local_e0 * auVar12._0_4_ + local_d0 * auVar178._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar296._0_4_;
      auVar129._4_4_ =
           fStack_dc * auVar12._4_4_ + fStack_cc * auVar178._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar296._4_4_;
      auVar129._8_4_ =
           fStack_d8 * auVar12._8_4_ + fStack_c8 * auVar178._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar296._8_4_;
      auVar129._12_4_ =
           fStack_d4 * auVar12._12_4_ + fStack_c4 * auVar178._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar296._12_4_;
      auVar129._16_4_ =
           local_e0 * auVar12._16_4_ + local_d0 * auVar178._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar296._16_4_;
      auVar129._20_4_ =
           fStack_dc * auVar12._20_4_ + fStack_cc * auVar178._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar296._20_4_;
      auVar129._24_4_ =
           fStack_d8 * auVar12._24_4_ + fStack_c8 * auVar178._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar296._24_4_;
      auVar129._28_4_ = auVar12._28_4_ + auVar178._28_4_ + auVar13._28_4_ + auVar296._28_4_;
      auVar296 = vpermilps_avx(auVar221,0);
      auVar12 = vpermilps_avx(auVar221,0x55);
      auVar178 = vpermilps_avx(auVar221,0xaa);
      auVar221 = vpermilps_avx(auVar221,0xff);
      auVar183._0_4_ =
           local_e0 * auVar296._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar178._0_4_ + local_b0 * auVar221._0_4_;
      auVar183._4_4_ =
           fStack_dc * auVar296._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar178._4_4_ + fStack_ac * auVar221._4_4_;
      auVar183._8_4_ =
           fStack_d8 * auVar296._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar178._8_4_ + fStack_a8 * auVar221._8_4_;
      auVar183._12_4_ =
           fStack_d4 * auVar296._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar178._12_4_ + fStack_a4 * auVar221._12_4_;
      auVar183._16_4_ =
           local_e0 * auVar296._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar178._16_4_ + local_b0 * auVar221._16_4_;
      auVar183._20_4_ =
           fStack_dc * auVar296._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar178._20_4_ + fStack_ac * auVar221._20_4_;
      auVar183._24_4_ =
           fStack_d8 * auVar296._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar178._24_4_ + fStack_a8 * auVar221._24_4_;
      auVar183._28_4_ = auVar296._28_4_ + auVar12._28_4_ + auVar178._28_4_ + auVar221._28_4_;
      auVar296 = vpermilps_avx(auVar11,0);
      auVar221 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar204._0_4_ =
           local_e0 * auVar296._0_4_ + local_d0 * auVar221._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar204._4_4_ =
           fStack_dc * auVar296._4_4_ + fStack_cc * auVar221._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar204._8_4_ =
           fStack_d8 * auVar296._8_4_ + fStack_c8 * auVar221._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar204._12_4_ =
           fStack_d4 * auVar296._12_4_ + fStack_c4 * auVar221._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar204._16_4_ =
           local_e0 * auVar296._16_4_ + local_d0 * auVar221._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar204._20_4_ =
           fStack_dc * auVar296._20_4_ + fStack_cc * auVar221._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar204._24_4_ =
           fStack_d8 * auVar296._24_4_ + fStack_c8 * auVar221._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar204._28_4_ = auVar296._28_4_ + auVar221._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar100._4_4_ = fStack_9c;
      auVar100._0_4_ = local_a0;
      auVar100._8_4_ = fStack_98;
      auVar100._12_4_ = fStack_94;
      auVar302._16_16_ = auVar100;
      auVar302._0_16_ = auVar100;
      auVar296 = vpermilps_avx(auVar9,0);
      auVar221 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar231._0_4_ =
           local_a0 * auVar296._0_4_ + local_90 * auVar221._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar9._0_4_;
      auVar231._4_4_ =
           fStack_9c * auVar296._4_4_ + fStack_8c * auVar221._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar9._4_4_;
      auVar231._8_4_ =
           fStack_98 * auVar296._8_4_ + fStack_88 * auVar221._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar9._8_4_;
      auVar231._12_4_ =
           fStack_94 * auVar296._12_4_ + fStack_84 * auVar221._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar9._12_4_;
      auVar231._16_4_ =
           local_a0 * auVar296._16_4_ + local_90 * auVar221._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar9._16_4_;
      auVar231._20_4_ =
           fStack_9c * auVar296._20_4_ + fStack_8c * auVar221._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar9._20_4_;
      auVar231._24_4_ =
           fStack_98 * auVar296._24_4_ + fStack_88 * auVar221._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar9._24_4_;
      auVar231._28_4_ = auVar296._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar296 = vpermilps_avx(auVar10,0x55);
      auVar221 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar251._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar296._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar10._0_4_;
      auVar251._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar296._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar10._4_4_;
      auVar251._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar296._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar10._8_4_;
      auVar251._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar296._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar10._12_4_;
      auVar251._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar296._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar10._16_4_;
      auVar251._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar296._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar10._20_4_;
      auVar251._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar296._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar10._24_4_;
      auVar251._28_4_ = auVar9._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar179,0);
      auVar10 = vpermilps_avx(auVar179,0x55);
      auVar296 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      fVar237 = auVar179._28_4_;
      auVar261._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar179._0_4_;
      auVar261._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar179._4_4_;
      auVar261._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar179._8_4_;
      auVar261._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar179._12_4_;
      auVar261._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar179._16_4_;
      auVar261._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar179._20_4_;
      auVar261._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar179._24_4_;
      auVar261._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar296._28_4_ + fVar237;
      auVar9 = vsubps_avx(auVar129,auVar231);
      auVar130._0_4_ = auVar129._0_4_ + auVar231._0_4_;
      auVar130._4_4_ = auVar129._4_4_ + auVar231._4_4_;
      auVar130._8_4_ = auVar129._8_4_ + auVar231._8_4_;
      auVar130._12_4_ = auVar129._12_4_ + auVar231._12_4_;
      auVar130._16_4_ = auVar129._16_4_ + auVar231._16_4_;
      auVar130._20_4_ = auVar129._20_4_ + auVar231._20_4_;
      auVar130._24_4_ = auVar129._24_4_ + auVar231._24_4_;
      auVar130._28_4_ = auVar129._28_4_ + auVar231._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar183,auVar251);
      auVar184._0_4_ = auVar183._0_4_ + auVar251._0_4_;
      auVar184._4_4_ = auVar183._4_4_ + auVar251._4_4_;
      auVar184._8_4_ = auVar183._8_4_ + auVar251._8_4_;
      auVar184._12_4_ = auVar183._12_4_ + auVar251._12_4_;
      auVar184._16_4_ = auVar183._16_4_ + auVar251._16_4_;
      auVar184._20_4_ = auVar183._20_4_ + auVar251._20_4_;
      auVar184._24_4_ = auVar183._24_4_ + auVar251._24_4_;
      auVar184._28_4_ = auVar183._28_4_ + auVar251._28_4_;
      auVar178 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar204,auVar261);
      auVar205._0_4_ = auVar204._0_4_ + auVar261._0_4_;
      auVar205._4_4_ = auVar204._4_4_ + auVar261._4_4_;
      auVar205._8_4_ = auVar204._8_4_ + auVar261._8_4_;
      auVar205._12_4_ = auVar204._12_4_ + auVar261._12_4_;
      auVar205._16_4_ = auVar204._16_4_ + auVar261._16_4_;
      auVar205._20_4_ = auVar204._20_4_ + auVar261._20_4_;
      auVar205._24_4_ = auVar204._24_4_ + auVar261._24_4_;
      auVar205._28_4_ = auVar204._28_4_ + auVar261._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar179 = vperm2f128_avx(auVar13,auVar205,0x13);
      auVar296 = vperm2f128_avx(auVar13,auVar205,2);
      auVar221 = vperm2f128_avx(auVar178,auVar184,0x13);
      auVar11 = vperm2f128_avx(auVar178,auVar184,2);
      auVar9 = vperm2f128_avx(auVar10,auVar130,0x13);
      auVar12 = vperm2f128_avx(auVar10,auVar130,2);
      auVar14 = vpermilps_avx(auVar302,0xff);
      auVar15 = vpermilps_avx(auVar302,0xaa);
      auVar16 = vpermilps_avx(auVar302,0x55);
      auVar125 = vpermilps_avx(auVar302,0);
      fVar115 = auVar9._0_4_;
      fVar238 = auVar125._0_4_;
      fVar344 = auVar9._4_4_;
      fVar239 = auVar125._4_4_;
      fVar175 = auVar9._8_4_;
      fVar240 = auVar125._8_4_;
      fVar196 = auVar9._12_4_;
      fVar255 = auVar125._12_4_;
      fVar199 = auVar9._16_4_;
      fVar256 = auVar125._16_4_;
      fVar210 = auVar9._20_4_;
      fVar257 = auVar125._20_4_;
      fVar226 = auVar9._24_4_;
      fVar258 = auVar125._24_4_;
      fVar334 = auVar221._0_4_;
      fVar263 = auVar16._0_4_;
      fVar174 = auVar221._4_4_;
      fVar264 = auVar16._4_4_;
      fVar348 = auVar221._8_4_;
      fVar265 = auVar16._8_4_;
      fVar197 = auVar221._12_4_;
      fVar266 = auVar16._12_4_;
      fVar208 = auVar221._16_4_;
      fVar282 = auVar16._16_4_;
      fVar211 = auVar221._20_4_;
      fVar283 = auVar16._20_4_;
      fVar227 = auVar221._24_4_;
      fVar284 = auVar16._24_4_;
      fVar173 = auVar179._0_4_;
      fVar287 = auVar15._0_4_;
      fVar346 = auVar179._4_4_;
      fVar311 = auVar15._4_4_;
      fVar176 = auVar179._8_4_;
      fVar312 = auVar15._8_4_;
      fVar198 = auVar179._12_4_;
      fVar313 = auVar15._12_4_;
      fVar209 = auVar179._16_4_;
      fVar314 = auVar15._16_4_;
      fVar225 = auVar179._20_4_;
      fVar323 = auVar15._20_4_;
      fVar228 = auVar179._24_4_;
      fVar324 = auVar15._24_4_;
      auVar358._0_4_ = fVar287 * fVar173 + fVar263 * fVar334 + fVar238 * fVar115;
      auVar358._4_4_ = fVar311 * fVar346 + fVar264 * fVar174 + fVar239 * fVar344;
      auVar358._8_4_ = fVar312 * fVar176 + fVar265 * fVar348 + fVar240 * fVar175;
      auVar358._12_4_ = fVar313 * fVar198 + fVar266 * fVar197 + fVar255 * fVar196;
      auVar358._16_4_ = fVar314 * fVar209 + fVar282 * fVar208 + fVar256 * fVar199;
      auVar358._20_4_ = fVar323 * fVar225 + fVar283 * fVar211 + fVar257 * fVar210;
      auVar358._24_4_ = fVar324 * fVar228 + fVar284 * fVar227 + fVar258 * fVar226;
      auVar358._28_4_ = auVar13._28_4_ + auVar178._28_4_ + auVar10._28_4_;
      auVar25._4_4_ = fVar264 * fVar344;
      auVar25._0_4_ = fVar263 * fVar115;
      auVar25._8_4_ = fVar265 * fVar175;
      auVar25._12_4_ = fVar266 * fVar196;
      auVar25._16_4_ = fVar282 * fVar199;
      auVar25._20_4_ = fVar283 * fVar210;
      auVar25._24_4_ = fVar284 * fVar226;
      auVar25._28_4_ = auVar178._28_4_;
      fVar325 = auVar14._0_4_;
      fVar384 = auVar14._4_4_;
      fVar386 = auVar14._8_4_;
      fVar330 = auVar14._12_4_;
      fVar331 = auVar14._16_4_;
      fVar332 = auVar14._20_4_;
      fVar333 = auVar14._24_4_;
      auVar377._0_4_ = fVar238 * fVar173 + fVar325 * fVar334;
      auVar377._4_4_ = fVar239 * fVar346 + fVar384 * fVar174;
      auVar377._8_4_ = fVar240 * fVar176 + fVar386 * fVar348;
      auVar377._12_4_ = fVar255 * fVar198 + fVar330 * fVar197;
      auVar377._16_4_ = fVar256 * fVar209 + fVar331 * fVar208;
      auVar377._20_4_ = fVar257 * fVar225 + fVar332 * fVar211;
      auVar377._24_4_ = fVar258 * fVar228 + fVar333 * fVar227;
      auVar377._28_4_ = fVar237 + auVar13._28_4_;
      auVar9 = vsubps_avx(auVar25,auVar377);
      auVar26._4_4_ = fVar311 * fVar344;
      auVar26._0_4_ = fVar287 * fVar115;
      auVar26._8_4_ = fVar312 * fVar175;
      auVar26._12_4_ = fVar313 * fVar196;
      auVar26._16_4_ = fVar314 * fVar199;
      auVar26._20_4_ = fVar323 * fVar210;
      auVar26._24_4_ = fVar324 * fVar226;
      auVar26._28_4_ = auVar377._28_4_;
      auVar27._4_4_ = fVar239 * fVar174;
      auVar27._0_4_ = fVar238 * fVar334;
      auVar27._8_4_ = fVar240 * fVar348;
      auVar27._12_4_ = fVar255 * fVar197;
      auVar27._16_4_ = fVar256 * fVar208;
      auVar27._20_4_ = fVar257 * fVar211;
      auVar27._24_4_ = fVar258 * fVar227;
      auVar27._28_4_ = fVar237;
      auVar10 = vsubps_avx(auVar26,auVar27);
      auVar378._0_4_ = auVar10._0_4_ + fVar325 * fVar173;
      auVar378._4_4_ = auVar10._4_4_ + fVar384 * fVar346;
      auVar378._8_4_ = auVar10._8_4_ + fVar386 * fVar176;
      auVar378._12_4_ = auVar10._12_4_ + fVar330 * fVar198;
      auVar378._16_4_ = auVar10._16_4_ + fVar331 * fVar209;
      auVar378._20_4_ = auVar10._20_4_ + fVar332 * fVar225;
      auVar378._24_4_ = auVar10._24_4_ + fVar333 * fVar228;
      auVar378._28_4_ = auVar10._28_4_ + fVar237;
      auVar28._4_4_ = fVar311 * fVar174;
      auVar28._0_4_ = fVar287 * fVar334;
      auVar28._8_4_ = fVar312 * fVar348;
      auVar28._12_4_ = fVar313 * fVar197;
      auVar28._16_4_ = fVar314 * fVar208;
      auVar28._20_4_ = fVar323 * fVar211;
      auVar28._24_4_ = fVar324 * fVar227;
      auVar28._28_4_ = auVar221._28_4_;
      auVar392._0_4_ = fVar325 * fVar115 + fVar263 * fVar173;
      auVar392._4_4_ = fVar384 * fVar344 + fVar264 * fVar346;
      auVar392._8_4_ = fVar386 * fVar175 + fVar265 * fVar176;
      auVar392._12_4_ = fVar330 * fVar196 + fVar266 * fVar198;
      auVar392._16_4_ = fVar331 * fVar199 + fVar282 * fVar209;
      auVar392._20_4_ = fVar332 * fVar210 + fVar283 * fVar225;
      auVar392._24_4_ = fVar333 * fVar226 + fVar284 * fVar228;
      auVar392._28_4_ = fVar237 + auVar179._28_4_;
      auVar10 = vsubps_avx(auVar392,auVar28);
      auVar93._4_4_ = fStack_d4;
      auVar93._0_4_ = fStack_d8;
      auVar93._8_4_ = local_d0;
      auVar93._12_4_ = fStack_cc;
      auVar185._16_16_ = auVar93;
      auVar185._0_16_ = auVar93;
      auVar221 = vpermilps_avx(auVar185,0xff);
      auVar178 = vpermilps_avx(auVar185,0xaa);
      auVar179 = vpermilps_avx(auVar185,0);
      fVar348 = auVar12._0_4_ * auVar179._0_4_;
      fVar176 = auVar12._4_4_ * auVar179._4_4_;
      auVar29._4_4_ = fVar176;
      auVar29._0_4_ = fVar348;
      fVar196 = auVar12._8_4_ * auVar179._8_4_;
      auVar29._8_4_ = fVar196;
      fVar197 = auVar12._12_4_ * auVar179._12_4_;
      auVar29._12_4_ = fVar197;
      fVar198 = auVar12._16_4_ * auVar179._16_4_;
      auVar29._16_4_ = fVar198;
      fVar199 = auVar12._20_4_ * auVar179._20_4_;
      auVar29._20_4_ = fVar199;
      fVar208 = auVar12._24_4_ * auVar179._24_4_;
      auVar29._24_4_ = fVar208;
      auVar29._28_4_ = auVar14._28_4_;
      fVar115 = auVar296._0_4_ * auVar179._0_4_;
      fVar334 = auVar296._4_4_ * auVar179._4_4_;
      auVar30._4_4_ = fVar334;
      auVar30._0_4_ = fVar115;
      fVar173 = auVar296._8_4_ * auVar179._8_4_;
      auVar30._8_4_ = fVar173;
      fVar344 = auVar296._12_4_ * auVar179._12_4_;
      auVar30._12_4_ = fVar344;
      fVar174 = auVar296._16_4_ * auVar179._16_4_;
      auVar30._16_4_ = fVar174;
      fVar346 = auVar296._20_4_ * auVar179._20_4_;
      auVar30._20_4_ = fVar346;
      fVar175 = auVar296._24_4_ * auVar179._24_4_;
      auVar30._24_4_ = fVar175;
      auVar30._28_4_ = auVar296._28_4_;
      auVar341._0_4_ = fVar348 + fVar115;
      auVar341._4_4_ = fVar176 + fVar334;
      auVar341._8_4_ = fVar196 + fVar173;
      auVar341._12_4_ = fVar197 + fVar344;
      auVar341._16_4_ = fVar198 + fVar174;
      auVar341._20_4_ = fVar199 + fVar346;
      auVar341._24_4_ = fVar208 + fVar175;
      auVar341._28_4_ = auVar14._28_4_ + auVar296._28_4_;
      auVar179 = vsubps_avx(auVar29,auVar30);
      auVar278._0_4_ = auVar11._0_4_ * auVar178._0_4_;
      auVar278._4_4_ = auVar11._4_4_ * auVar178._4_4_;
      auVar278._8_4_ = auVar11._8_4_ * auVar178._8_4_;
      auVar278._12_4_ = auVar11._12_4_ * auVar178._12_4_;
      auVar278._16_4_ = auVar11._16_4_ * auVar178._16_4_;
      auVar278._20_4_ = auVar11._20_4_ * auVar178._20_4_;
      auVar278._24_4_ = auVar11._24_4_ * auVar178._24_4_;
      auVar278._28_36_ = auVar286;
      auVar303._0_4_ = auVar341._0_4_ + auVar278._0_4_;
      auVar303._4_4_ = auVar341._4_4_ + auVar278._4_4_;
      auVar303._8_4_ = auVar341._8_4_ + auVar278._8_4_;
      auVar303._12_4_ = auVar341._12_4_ + auVar278._12_4_;
      auVar303._16_4_ = auVar341._16_4_ + auVar278._16_4_;
      auVar303._20_4_ = auVar341._20_4_ + auVar278._20_4_;
      auVar303._24_4_ = auVar341._24_4_ + auVar278._24_4_;
      fVar115 = auVar286._0_4_;
      auVar303._28_4_ = auVar341._28_4_ + fVar115;
      auVar296 = vsubps_avx(auVar341,auVar278._0_32_);
      fVar334 = auVar11._0_4_ * auVar221._0_4_;
      fVar173 = auVar11._4_4_ * auVar221._4_4_;
      auVar31._4_4_ = fVar173;
      auVar31._0_4_ = fVar334;
      fVar344 = auVar11._8_4_ * auVar221._8_4_;
      auVar31._8_4_ = fVar344;
      fVar174 = auVar11._12_4_ * auVar221._12_4_;
      auVar31._12_4_ = fVar174;
      fVar346 = auVar11._16_4_ * auVar221._16_4_;
      auVar31._16_4_ = fVar346;
      fVar175 = auVar11._20_4_ * auVar221._20_4_;
      auVar31._20_4_ = fVar175;
      fVar348 = auVar11._24_4_ * auVar221._24_4_;
      auVar31._24_4_ = fVar348;
      auVar31._28_4_ = fVar115;
      auVar319._0_4_ = auVar179._0_4_ + fVar334;
      auVar319._4_4_ = auVar179._4_4_ + fVar173;
      auVar319._8_4_ = auVar179._8_4_ + fVar344;
      auVar319._12_4_ = auVar179._12_4_ + fVar174;
      auVar319._16_4_ = auVar179._16_4_ + fVar346;
      auVar319._20_4_ = auVar179._20_4_ + fVar175;
      auVar319._24_4_ = auVar179._24_4_ + fVar348;
      auVar319._28_4_ = auVar179._28_4_ + fVar115;
      auVar179 = vsubps_avx(auVar179,auVar31);
      auVar221 = vsubps_avx(auVar303,auVar358);
      auVar11 = vsubps_avx(auVar319,auVar9);
      auVar12 = vsubps_avx(auVar179,auVar378);
      auVar178 = vsubps_avx(auVar296,auVar10);
      *(float *)(undefined1 *)local_108._buffer = auVar303._0_4_ + auVar358._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar303._4_4_ + auVar358._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar303._8_4_ + auVar358._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar303._12_4_ + auVar358._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar303._16_4_ + auVar358._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar303._20_4_ + auVar358._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar303._24_4_ + auVar358._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar303._28_4_ + auVar358._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar319._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar319._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar319._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar319._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar319._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar319._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar319._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar319._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar179._0_4_ + auVar378._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar179._4_4_ + auVar378._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar179._8_4_ + auVar378._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar179._12_4_ + auVar378._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar179._16_4_ + auVar378._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar179._20_4_ + auVar378._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar179._24_4_ + auVar378._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar179._28_4_ + auVar378._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar296._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar296._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar296._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar296._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar296._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar296._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar296._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar296._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar178;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar221;
      in_ZMM7 = ZEXT1664(auVar221._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"5x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar286 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x28) {
          auVar168._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar168._8_56_ = extraout_var_18;
          in_ZMM0._4_60_ = auVar168._4_60_;
          in_ZMM0._0_4_ = (float)auVar168._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar379._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar379._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar393._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar393._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar379,auVar393);
      auVar9 = vunpckhpd_avx(auVar379,auVar393);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar296 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar359._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar359._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar367._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar367._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar179 = vunpcklpd_avx(auVar359,auVar367);
      auVar10 = vunpckhpd_avx(auVar359,auVar367);
      auVar11 = vunpcklps_avx(auVar179,auVar10);
      auVar10 = vunpckhps_avx(auVar179,auVar10);
      auVar221 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar329._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xa0);
      auVar329._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x80);
      auVar342._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0xb0);
      auVar342._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar329,auVar342);
      auVar179 = vunpckhpd_avx(auVar329,auVar342);
      auVar12 = vunpcklps_avx(auVar11,auVar179);
      auVar179 = vunpckhps_avx(auVar11,auVar179);
      auVar11 = vunpcklpd_avx(auVar12,auVar179);
      auVar179 = vunpckhpd_avx(auVar12,auVar179);
      auVar12 = vpermilps_avx(auVar296,0);
      auVar178 = vpermilps_avx(auVar296,0x55);
      auVar13 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar131._0_4_ =
           local_e0 * auVar12._0_4_ + local_d0 * auVar178._0_4_ +
           local_c0 * auVar13._0_4_ + local_b0 * auVar296._0_4_;
      auVar131._4_4_ =
           fStack_dc * auVar12._4_4_ + fStack_cc * auVar178._4_4_ +
           fStack_bc * auVar13._4_4_ + fStack_ac * auVar296._4_4_;
      auVar131._8_4_ =
           fStack_d8 * auVar12._8_4_ + fStack_c8 * auVar178._8_4_ +
           fStack_b8 * auVar13._8_4_ + fStack_a8 * auVar296._8_4_;
      auVar131._12_4_ =
           fStack_d4 * auVar12._12_4_ + fStack_c4 * auVar178._12_4_ +
           fStack_b4 * auVar13._12_4_ + fStack_a4 * auVar296._12_4_;
      auVar131._16_4_ =
           local_e0 * auVar12._16_4_ + local_d0 * auVar178._16_4_ +
           local_c0 * auVar13._16_4_ + local_b0 * auVar296._16_4_;
      auVar131._20_4_ =
           fStack_dc * auVar12._20_4_ + fStack_cc * auVar178._20_4_ +
           fStack_bc * auVar13._20_4_ + fStack_ac * auVar296._20_4_;
      auVar131._24_4_ =
           fStack_d8 * auVar12._24_4_ + fStack_c8 * auVar178._24_4_ +
           fStack_b8 * auVar13._24_4_ + fStack_a8 * auVar296._24_4_;
      auVar131._28_4_ = auVar12._28_4_ + auVar178._28_4_ + auVar13._28_4_ + auVar296._28_4_;
      auVar296 = vpermilps_avx(auVar221,0);
      auVar12 = vpermilps_avx(auVar221,0x55);
      auVar178 = vpermilps_avx(auVar221,0xaa);
      auVar221 = vpermilps_avx(auVar221,0xff);
      auVar186._0_4_ =
           local_e0 * auVar296._0_4_ + local_d0 * auVar12._0_4_ +
           local_c0 * auVar178._0_4_ + local_b0 * auVar221._0_4_;
      auVar186._4_4_ =
           fStack_dc * auVar296._4_4_ + fStack_cc * auVar12._4_4_ +
           fStack_bc * auVar178._4_4_ + fStack_ac * auVar221._4_4_;
      auVar186._8_4_ =
           fStack_d8 * auVar296._8_4_ + fStack_c8 * auVar12._8_4_ +
           fStack_b8 * auVar178._8_4_ + fStack_a8 * auVar221._8_4_;
      auVar186._12_4_ =
           fStack_d4 * auVar296._12_4_ + fStack_c4 * auVar12._12_4_ +
           fStack_b4 * auVar178._12_4_ + fStack_a4 * auVar221._12_4_;
      auVar186._16_4_ =
           local_e0 * auVar296._16_4_ + local_d0 * auVar12._16_4_ +
           local_c0 * auVar178._16_4_ + local_b0 * auVar221._16_4_;
      auVar186._20_4_ =
           fStack_dc * auVar296._20_4_ + fStack_cc * auVar12._20_4_ +
           fStack_bc * auVar178._20_4_ + fStack_ac * auVar221._20_4_;
      auVar186._24_4_ =
           fStack_d8 * auVar296._24_4_ + fStack_c8 * auVar12._24_4_ +
           fStack_b8 * auVar178._24_4_ + fStack_a8 * auVar221._24_4_;
      auVar186._28_4_ = auVar296._28_4_ + auVar12._28_4_ + auVar178._28_4_ + auVar221._28_4_;
      auVar296 = vpermilps_avx(auVar11,0);
      auVar221 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar206._0_4_ =
           local_e0 * auVar296._0_4_ + local_d0 * auVar221._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar11._0_4_;
      auVar206._4_4_ =
           fStack_dc * auVar296._4_4_ + fStack_cc * auVar221._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar11._4_4_;
      auVar206._8_4_ =
           fStack_d8 * auVar296._8_4_ + fStack_c8 * auVar221._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar11._8_4_;
      auVar206._12_4_ =
           fStack_d4 * auVar296._12_4_ + fStack_c4 * auVar221._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar11._12_4_;
      auVar206._16_4_ =
           local_e0 * auVar296._16_4_ + local_d0 * auVar221._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar11._16_4_;
      auVar206._20_4_ =
           fStack_dc * auVar296._20_4_ + fStack_cc * auVar221._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar11._20_4_;
      auVar206._24_4_ =
           fStack_d8 * auVar296._24_4_ + fStack_c8 * auVar221._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar11._24_4_;
      auVar206._28_4_ = auVar296._28_4_ + auVar221._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar101._4_4_ = fStack_9c;
      auVar101._0_4_ = local_a0;
      auVar101._8_4_ = fStack_98;
      auVar101._12_4_ = fStack_94;
      auVar304._16_16_ = auVar101;
      auVar304._0_16_ = auVar101;
      auVar296 = vpermilps_avx(auVar9,0);
      auVar221 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar232._0_4_ =
           local_a0 * auVar296._0_4_ + local_90 * auVar221._0_4_ +
           local_80 * auVar11._0_4_ + local_70 * auVar9._0_4_;
      auVar232._4_4_ =
           fStack_9c * auVar296._4_4_ + fStack_8c * auVar221._4_4_ +
           fStack_7c * auVar11._4_4_ + fStack_6c * auVar9._4_4_;
      auVar232._8_4_ =
           fStack_98 * auVar296._8_4_ + fStack_88 * auVar221._8_4_ +
           fStack_78 * auVar11._8_4_ + fStack_68 * auVar9._8_4_;
      auVar232._12_4_ =
           fStack_94 * auVar296._12_4_ + fStack_84 * auVar221._12_4_ +
           fStack_74 * auVar11._12_4_ + fStack_64 * auVar9._12_4_;
      auVar232._16_4_ =
           local_a0 * auVar296._16_4_ + local_90 * auVar221._16_4_ +
           local_80 * auVar11._16_4_ + local_70 * auVar9._16_4_;
      auVar232._20_4_ =
           fStack_9c * auVar296._20_4_ + fStack_8c * auVar221._20_4_ +
           fStack_7c * auVar11._20_4_ + fStack_6c * auVar9._20_4_;
      auVar232._24_4_ =
           fStack_98 * auVar296._24_4_ + fStack_88 * auVar221._24_4_ +
           fStack_78 * auVar11._24_4_ + fStack_68 * auVar9._24_4_;
      auVar232._28_4_ = auVar296._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar296 = vpermilps_avx(auVar10,0x55);
      auVar221 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar252._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar296._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar10._0_4_;
      auVar252._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar296._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar10._4_4_;
      auVar252._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar296._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar10._8_4_;
      auVar252._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar296._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar10._12_4_;
      auVar252._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar296._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar10._16_4_;
      auVar252._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar296._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar10._20_4_;
      auVar252._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar296._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar10._24_4_;
      auVar252._28_4_ = auVar9._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar179,0);
      auVar10 = vpermilps_avx(auVar179,0x55);
      auVar296 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      fVar209 = auVar179._28_4_;
      auVar262._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar10._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar179._0_4_;
      auVar262._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar10._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar179._4_4_;
      auVar262._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar10._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar179._8_4_;
      auVar262._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar10._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar179._12_4_;
      auVar262._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar10._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar179._16_4_;
      auVar262._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar10._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar179._20_4_;
      auVar262._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar10._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar179._24_4_;
      auVar262._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar296._28_4_ + fVar209;
      auVar9 = vsubps_avx(auVar131,auVar232);
      auVar132._0_4_ = auVar131._0_4_ + auVar232._0_4_;
      auVar132._4_4_ = auVar131._4_4_ + auVar232._4_4_;
      auVar132._8_4_ = auVar131._8_4_ + auVar232._8_4_;
      auVar132._12_4_ = auVar131._12_4_ + auVar232._12_4_;
      auVar132._16_4_ = auVar131._16_4_ + auVar232._16_4_;
      auVar132._20_4_ = auVar131._20_4_ + auVar232._20_4_;
      auVar132._24_4_ = auVar131._24_4_ + auVar232._24_4_;
      auVar132._28_4_ = auVar131._28_4_ + auVar232._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar186,auVar252);
      auVar187._0_4_ = auVar186._0_4_ + auVar252._0_4_;
      auVar187._4_4_ = auVar186._4_4_ + auVar252._4_4_;
      auVar187._8_4_ = auVar186._8_4_ + auVar252._8_4_;
      auVar187._12_4_ = auVar186._12_4_ + auVar252._12_4_;
      auVar187._16_4_ = auVar186._16_4_ + auVar252._16_4_;
      auVar187._20_4_ = auVar186._20_4_ + auVar252._20_4_;
      auVar187._24_4_ = auVar186._24_4_ + auVar252._24_4_;
      auVar187._28_4_ = auVar186._28_4_ + auVar252._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar206,auVar262);
      auVar207._0_4_ = auVar206._0_4_ + auVar262._0_4_;
      auVar207._4_4_ = auVar206._4_4_ + auVar262._4_4_;
      auVar207._8_4_ = auVar206._8_4_ + auVar262._8_4_;
      auVar207._12_4_ = auVar206._12_4_ + auVar262._12_4_;
      auVar207._16_4_ = auVar206._16_4_ + auVar262._16_4_;
      auVar207._20_4_ = auVar206._20_4_ + auVar262._20_4_;
      auVar207._24_4_ = auVar206._24_4_ + auVar262._24_4_;
      auVar207._28_4_ = auVar206._28_4_ + auVar262._28_4_;
      auVar178 = vpermilps_avx(auVar9,0x1b);
      auVar296 = vperm2f128_avx(auVar178,auVar207,2);
      auVar179 = vperm2f128_avx(auVar12,auVar187,0x13);
      auVar11 = vperm2f128_avx(auVar12,auVar187,2);
      auVar9 = vperm2f128_avx(auVar10,auVar132,0x13);
      auVar221 = vperm2f128_avx(auVar10,auVar132,2);
      auVar13 = vpermilps_avx(auVar304,0xff);
      auVar14 = vpermilps_avx(auVar304,0xaa);
      auVar15 = vpermilps_avx(auVar304,0x55);
      auVar16 = vpermilps_avx(auVar304,0);
      fVar115 = auVar9._0_4_;
      fVar173 = auVar9._4_4_;
      fVar174 = auVar9._8_4_;
      fVar175 = auVar9._12_4_;
      fVar176 = auVar9._16_4_;
      fVar197 = auVar9._20_4_;
      fVar199 = auVar9._24_4_;
      fVar334 = auVar179._0_4_;
      fVar344 = auVar179._4_4_;
      fVar346 = auVar179._8_4_;
      fVar348 = auVar179._12_4_;
      fVar196 = auVar179._16_4_;
      fVar198 = auVar179._20_4_;
      fVar208 = auVar179._24_4_;
      auVar360._0_4_ = auVar15._0_4_ * fVar334 + auVar16._0_4_ * fVar115;
      auVar360._4_4_ = auVar15._4_4_ * fVar344 + auVar16._4_4_ * fVar173;
      auVar360._8_4_ = auVar15._8_4_ * fVar346 + auVar16._8_4_ * fVar174;
      auVar360._12_4_ = auVar15._12_4_ * fVar348 + auVar16._12_4_ * fVar175;
      auVar360._16_4_ = auVar15._16_4_ * fVar196 + auVar16._16_4_ * fVar176;
      auVar360._20_4_ = auVar15._20_4_ * fVar198 + auVar16._20_4_ * fVar197;
      auVar360._24_4_ = auVar15._24_4_ * fVar208 + auVar16._24_4_ * fVar199;
      auVar360._28_4_ = auVar12._28_4_ + auVar10._28_4_;
      auVar32._4_4_ = auVar15._4_4_ * fVar173;
      auVar32._0_4_ = auVar15._0_4_ * fVar115;
      auVar32._8_4_ = auVar15._8_4_ * fVar174;
      auVar32._12_4_ = auVar15._12_4_ * fVar175;
      auVar32._16_4_ = auVar15._16_4_ * fVar176;
      auVar32._20_4_ = auVar15._20_4_ * fVar197;
      auVar32._24_4_ = auVar15._24_4_ * fVar199;
      auVar32._28_4_ = auVar12._28_4_;
      auVar33._4_4_ = auVar13._4_4_ * fVar344;
      auVar33._0_4_ = auVar13._0_4_ * fVar334;
      auVar33._8_4_ = auVar13._8_4_ * fVar346;
      auVar33._12_4_ = auVar13._12_4_ * fVar348;
      auVar33._16_4_ = auVar13._16_4_ * fVar196;
      auVar33._20_4_ = auVar13._20_4_ * fVar198;
      auVar33._24_4_ = auVar13._24_4_ * fVar208;
      auVar33._28_4_ = auVar178._28_4_;
      auVar9 = vsubps_avx(auVar32,auVar33);
      auVar34._4_4_ = auVar14._4_4_ * fVar173;
      auVar34._0_4_ = auVar14._0_4_ * fVar115;
      auVar34._8_4_ = auVar14._8_4_ * fVar174;
      auVar34._12_4_ = auVar14._12_4_ * fVar175;
      auVar34._16_4_ = auVar14._16_4_ * fVar176;
      auVar34._20_4_ = auVar14._20_4_ * fVar197;
      auVar34._24_4_ = auVar14._24_4_ * fVar199;
      auVar34._28_4_ = auVar178._28_4_;
      auVar35._4_4_ = auVar16._4_4_ * fVar344;
      auVar35._0_4_ = auVar16._0_4_ * fVar334;
      auVar35._8_4_ = auVar16._8_4_ * fVar346;
      auVar35._12_4_ = auVar16._12_4_ * fVar348;
      auVar35._16_4_ = auVar16._16_4_ * fVar196;
      auVar35._20_4_ = auVar16._20_4_ * fVar198;
      auVar35._24_4_ = auVar16._24_4_ * fVar208;
      auVar35._28_4_ = fVar209;
      auVar10 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = auVar13._4_4_ * fVar173;
      auVar36._0_4_ = auVar13._0_4_ * fVar115;
      auVar36._8_4_ = auVar13._8_4_ * fVar174;
      auVar36._12_4_ = auVar13._12_4_ * fVar175;
      auVar36._16_4_ = auVar13._16_4_ * fVar176;
      auVar36._20_4_ = auVar13._20_4_ * fVar197;
      auVar36._24_4_ = auVar13._24_4_ * fVar199;
      auVar36._28_4_ = fVar209;
      auVar37._4_4_ = auVar14._4_4_ * fVar344;
      auVar37._0_4_ = auVar14._0_4_ * fVar334;
      auVar37._8_4_ = auVar14._8_4_ * fVar346;
      auVar37._12_4_ = auVar14._12_4_ * fVar348;
      auVar37._16_4_ = auVar14._16_4_ * fVar196;
      auVar37._20_4_ = auVar14._20_4_ * fVar198;
      auVar37._24_4_ = auVar14._24_4_ * fVar208;
      auVar37._28_4_ = auVar179._28_4_;
      auVar179 = vsubps_avx(auVar36,auVar37);
      auVar94._4_4_ = fStack_d4;
      auVar94._0_4_ = fStack_d8;
      auVar94._8_4_ = local_d0;
      auVar94._12_4_ = fStack_cc;
      auVar188._16_16_ = auVar94;
      auVar188._0_16_ = auVar94;
      auVar12 = vpermilps_avx(auVar188,0xff);
      auVar178 = vpermilps_avx(auVar188,0xaa);
      auVar14 = vpermilps_avx(auVar188,0);
      fVar348 = auVar221._0_4_ * auVar14._0_4_;
      fVar176 = auVar221._4_4_ * auVar14._4_4_;
      auVar38._4_4_ = fVar176;
      auVar38._0_4_ = fVar348;
      fVar196 = auVar221._8_4_ * auVar14._8_4_;
      auVar38._8_4_ = fVar196;
      fVar197 = auVar221._12_4_ * auVar14._12_4_;
      auVar38._12_4_ = fVar197;
      fVar198 = auVar221._16_4_ * auVar14._16_4_;
      auVar38._16_4_ = fVar198;
      fVar199 = auVar221._20_4_ * auVar14._20_4_;
      auVar38._20_4_ = fVar199;
      fVar208 = auVar221._24_4_ * auVar14._24_4_;
      auVar38._24_4_ = fVar208;
      auVar38._28_4_ = auVar13._28_4_;
      fVar115 = auVar296._0_4_ * auVar14._0_4_;
      fVar334 = auVar296._4_4_ * auVar14._4_4_;
      auVar39._4_4_ = fVar334;
      auVar39._0_4_ = fVar115;
      fVar173 = auVar296._8_4_ * auVar14._8_4_;
      auVar39._8_4_ = fVar173;
      fVar344 = auVar296._12_4_ * auVar14._12_4_;
      auVar39._12_4_ = fVar344;
      fVar174 = auVar296._16_4_ * auVar14._16_4_;
      auVar39._16_4_ = fVar174;
      fVar346 = auVar296._20_4_ * auVar14._20_4_;
      auVar39._20_4_ = fVar346;
      fVar175 = auVar296._24_4_ * auVar14._24_4_;
      auVar39._24_4_ = fVar175;
      auVar39._28_4_ = auVar296._28_4_;
      auVar343._0_4_ = fVar348 + fVar115;
      auVar343._4_4_ = fVar176 + fVar334;
      auVar343._8_4_ = fVar196 + fVar173;
      auVar343._12_4_ = fVar197 + fVar344;
      auVar343._16_4_ = fVar198 + fVar174;
      auVar343._20_4_ = fVar199 + fVar346;
      auVar343._24_4_ = fVar208 + fVar175;
      auVar343._28_4_ = auVar13._28_4_ + auVar296._28_4_;
      auVar296 = vsubps_avx(auVar38,auVar39);
      auVar279._0_4_ = auVar11._0_4_ * auVar178._0_4_;
      auVar279._4_4_ = auVar11._4_4_ * auVar178._4_4_;
      auVar279._8_4_ = auVar11._8_4_ * auVar178._8_4_;
      auVar279._12_4_ = auVar11._12_4_ * auVar178._12_4_;
      auVar279._16_4_ = auVar11._16_4_ * auVar178._16_4_;
      auVar279._20_4_ = auVar11._20_4_ * auVar178._20_4_;
      auVar279._24_4_ = auVar11._24_4_ * auVar178._24_4_;
      auVar279._28_36_ = auVar286;
      auVar305._0_4_ = auVar343._0_4_ + auVar279._0_4_;
      auVar305._4_4_ = auVar343._4_4_ + auVar279._4_4_;
      auVar305._8_4_ = auVar343._8_4_ + auVar279._8_4_;
      auVar305._12_4_ = auVar343._12_4_ + auVar279._12_4_;
      auVar305._16_4_ = auVar343._16_4_ + auVar279._16_4_;
      auVar305._20_4_ = auVar343._20_4_ + auVar279._20_4_;
      auVar305._24_4_ = auVar343._24_4_ + auVar279._24_4_;
      fVar115 = auVar286._0_4_;
      auVar305._28_4_ = auVar343._28_4_ + fVar115;
      auVar221 = vsubps_avx(auVar343,auVar279._0_32_);
      fVar334 = auVar11._0_4_ * auVar12._0_4_;
      fVar173 = auVar11._4_4_ * auVar12._4_4_;
      auVar40._4_4_ = fVar173;
      auVar40._0_4_ = fVar334;
      fVar344 = auVar11._8_4_ * auVar12._8_4_;
      auVar40._8_4_ = fVar344;
      fVar174 = auVar11._12_4_ * auVar12._12_4_;
      auVar40._12_4_ = fVar174;
      fVar346 = auVar11._16_4_ * auVar12._16_4_;
      auVar40._16_4_ = fVar346;
      fVar175 = auVar11._20_4_ * auVar12._20_4_;
      auVar40._20_4_ = fVar175;
      fVar348 = auVar11._24_4_ * auVar12._24_4_;
      auVar40._24_4_ = fVar348;
      auVar40._28_4_ = fVar115;
      auVar320._0_4_ = auVar296._0_4_ + fVar334;
      auVar320._4_4_ = auVar296._4_4_ + fVar173;
      auVar320._8_4_ = auVar296._8_4_ + fVar344;
      auVar320._12_4_ = auVar296._12_4_ + fVar174;
      auVar320._16_4_ = auVar296._16_4_ + fVar346;
      auVar320._20_4_ = auVar296._20_4_ + fVar175;
      auVar320._24_4_ = auVar296._24_4_ + fVar348;
      auVar320._28_4_ = auVar296._28_4_ + fVar115;
      auVar296 = vsubps_avx(auVar296,auVar40);
      auVar11 = vsubps_avx(auVar305,auVar360);
      auVar12 = vsubps_avx(auVar320,auVar9);
      auVar178 = vsubps_avx(auVar296,auVar10);
      auVar13 = vsubps_avx(auVar221,auVar179);
      *(float *)(undefined1 *)local_108._buffer = auVar305._0_4_ + auVar360._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar305._4_4_ + auVar360._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar305._8_4_ + auVar360._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar305._12_4_ + auVar360._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar305._16_4_ + auVar360._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar305._20_4_ + auVar360._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar305._24_4_ + auVar360._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar305._28_4_ + auVar360._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar320._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar320._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar320._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar320._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar320._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar320._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar320._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar320._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar296._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar296._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar296._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar296._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar296._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar296._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar296._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar296._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar221._0_4_ + auVar179._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar221._4_4_ + auVar179._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar221._8_4_ + auVar179._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar221._12_4_ + auVar179._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar221._16_4_ + auVar179._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar221._20_4_ + auVar179._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar221._24_4_ + auVar179._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar221._28_4_ + auVar179._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar178;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar11;
      in_ZMM7 = ZEXT1664(auVar11._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"4x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar286 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x20) {
          auVar169._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar169._8_56_ = extraout_var_19;
          in_ZMM0._4_60_ = auVar169._4_60_;
          in_ZMM0._0_4_ = (float)auVar169._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar380._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar380._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar394._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar394._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar380,auVar394);
      auVar9 = vunpckhpd_avx(auVar380,auVar394);
      auVar296 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar179 = vunpcklpd_avx(auVar296,auVar9);
      auVar9 = vunpckhpd_avx(auVar296,auVar9);
      auVar361._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar361._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar368._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar368._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar296 = vunpcklpd_avx(auVar361,auVar368);
      auVar10 = vunpckhpd_avx(auVar361,auVar368);
      auVar221 = vunpcklps_avx(auVar296,auVar10);
      auVar10 = vunpckhps_avx(auVar296,auVar10);
      auVar296 = vunpcklpd_avx(auVar221,auVar10);
      auVar10 = vunpckhpd_avx(auVar221,auVar10);
      auVar221 = vpermilps_avx(auVar179,0);
      auVar11 = vpermilps_avx(auVar179,0x55);
      auVar12 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar133._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar179._0_4_;
      auVar133._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar179._4_4_;
      auVar133._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar179._8_4_;
      auVar133._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar179._12_4_;
      auVar133._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar179._16_4_;
      auVar133._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar179._20_4_;
      auVar133._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar179._24_4_;
      auVar133._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar179._28_4_;
      auVar179 = vpermilps_avx(auVar296,0);
      auVar221 = vpermilps_avx(auVar296,0x55);
      auVar11 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar189._0_4_ =
           local_e0 * auVar179._0_4_ + local_d0 * auVar221._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar296._0_4_;
      auVar189._4_4_ =
           fStack_dc * auVar179._4_4_ + fStack_cc * auVar221._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar296._4_4_;
      auVar189._8_4_ =
           fStack_d8 * auVar179._8_4_ + fStack_c8 * auVar221._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar296._8_4_;
      auVar189._12_4_ =
           fStack_d4 * auVar179._12_4_ + fStack_c4 * auVar221._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar296._12_4_;
      auVar189._16_4_ =
           local_e0 * auVar179._16_4_ + local_d0 * auVar221._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar296._16_4_;
      auVar189._20_4_ =
           fStack_dc * auVar179._20_4_ + fStack_cc * auVar221._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar296._20_4_;
      auVar189._24_4_ =
           fStack_d8 * auVar179._24_4_ + fStack_c8 * auVar221._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar296._24_4_;
      auVar189._28_4_ = auVar179._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar296._28_4_;
      auVar102._4_4_ = fStack_9c;
      auVar102._0_4_ = local_a0;
      auVar102._8_4_ = fStack_98;
      auVar102._12_4_ = fStack_94;
      auVar306._16_16_ = auVar102;
      auVar306._0_16_ = auVar102;
      auVar179 = vpermilps_avx(auVar9,0);
      auVar296 = vpermilps_avx(auVar9,0x55);
      auVar221 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar233._0_4_ =
           local_a0 * auVar179._0_4_ + local_90 * auVar296._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar9._0_4_;
      auVar233._4_4_ =
           fStack_9c * auVar179._4_4_ + fStack_8c * auVar296._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar9._4_4_;
      auVar233._8_4_ =
           fStack_98 * auVar179._8_4_ + fStack_88 * auVar296._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar9._8_4_;
      auVar233._12_4_ =
           fStack_94 * auVar179._12_4_ + fStack_84 * auVar296._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar9._12_4_;
      auVar233._16_4_ =
           local_a0 * auVar179._16_4_ + local_90 * auVar296._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar9._16_4_;
      auVar233._20_4_ =
           fStack_9c * auVar179._20_4_ + fStack_8c * auVar296._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar9._20_4_;
      auVar233._24_4_ =
           fStack_98 * auVar179._24_4_ + fStack_88 * auVar296._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar9._24_4_;
      auVar233._28_4_ = auVar179._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar179 = vpermilps_avx(auVar10,0x55);
      auVar296 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar209 = auVar10._28_4_;
      fVar210 = auVar296._28_4_ + fVar209;
      auVar253._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar179._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar10._0_4_;
      auVar253._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar179._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar10._4_4_;
      auVar253._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar179._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar10._8_4_;
      auVar253._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar179._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar10._12_4_;
      auVar253._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar179._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar10._16_4_;
      auVar253._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar179._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar10._20_4_;
      auVar253._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar179._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar10._24_4_;
      auVar253._28_4_ = auVar9._28_4_ + auVar179._28_4_ + fVar210;
      auVar9 = vsubps_avx(auVar133,auVar233);
      auVar134._0_4_ = auVar133._0_4_ + auVar233._0_4_;
      auVar134._4_4_ = auVar133._4_4_ + auVar233._4_4_;
      auVar134._8_4_ = auVar133._8_4_ + auVar233._8_4_;
      auVar134._12_4_ = auVar133._12_4_ + auVar233._12_4_;
      auVar134._16_4_ = auVar133._16_4_ + auVar233._16_4_;
      auVar134._20_4_ = auVar133._20_4_ + auVar233._20_4_;
      auVar134._24_4_ = auVar133._24_4_ + auVar233._24_4_;
      auVar134._28_4_ = auVar133._28_4_ + auVar233._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar189,auVar253);
      auVar190._0_4_ = auVar189._0_4_ + auVar253._0_4_;
      auVar190._4_4_ = auVar189._4_4_ + auVar253._4_4_;
      auVar190._8_4_ = auVar189._8_4_ + auVar253._8_4_;
      auVar190._12_4_ = auVar189._12_4_ + auVar253._12_4_;
      auVar190._16_4_ = auVar189._16_4_ + auVar253._16_4_;
      auVar190._20_4_ = auVar189._20_4_ + auVar253._20_4_;
      auVar190._24_4_ = auVar189._24_4_ + auVar253._24_4_;
      auVar190._28_4_ = auVar189._28_4_ + auVar253._28_4_;
      auVar11 = vpermilps_avx(auVar9,0x1b);
      auVar179 = vperm2f128_avx(auVar11,auVar190,0x13);
      auVar221 = vperm2f128_avx(auVar11,auVar190,2);
      auVar9 = vperm2f128_avx(auVar10,auVar134,0x13);
      auVar296 = vperm2f128_avx(auVar10,auVar134,2);
      auVar12 = vpermilps_avx(auVar306,0xff);
      auVar178 = vpermilps_avx(auVar306,0xaa);
      auVar13 = vpermilps_avx(auVar306,0x55);
      auVar14 = vpermilps_avx(auVar306,0);
      fVar115 = auVar9._0_4_;
      fVar173 = auVar9._4_4_;
      fVar174 = auVar9._8_4_;
      fVar175 = auVar9._12_4_;
      fVar176 = auVar9._16_4_;
      fVar197 = auVar9._20_4_;
      fVar199 = auVar9._24_4_;
      fVar334 = auVar179._0_4_;
      fVar344 = auVar179._4_4_;
      fVar346 = auVar179._8_4_;
      fVar348 = auVar179._12_4_;
      fVar196 = auVar179._16_4_;
      fVar198 = auVar179._20_4_;
      fVar208 = auVar179._24_4_;
      auVar362._0_4_ = auVar13._0_4_ * fVar334 + auVar14._0_4_ * fVar115;
      auVar362._4_4_ = auVar13._4_4_ * fVar344 + auVar14._4_4_ * fVar173;
      auVar362._8_4_ = auVar13._8_4_ * fVar346 + auVar14._8_4_ * fVar174;
      auVar362._12_4_ = auVar13._12_4_ * fVar348 + auVar14._12_4_ * fVar175;
      auVar362._16_4_ = auVar13._16_4_ * fVar196 + auVar14._16_4_ * fVar176;
      auVar362._20_4_ = auVar13._20_4_ * fVar198 + auVar14._20_4_ * fVar197;
      auVar362._24_4_ = auVar13._24_4_ * fVar208 + auVar14._24_4_ * fVar199;
      auVar362._28_4_ = auVar11._28_4_ + auVar10._28_4_;
      auVar41._4_4_ = auVar13._4_4_ * fVar173;
      auVar41._0_4_ = auVar13._0_4_ * fVar115;
      auVar41._8_4_ = auVar13._8_4_ * fVar174;
      auVar41._12_4_ = auVar13._12_4_ * fVar175;
      auVar41._16_4_ = auVar13._16_4_ * fVar176;
      auVar41._20_4_ = auVar13._20_4_ * fVar197;
      auVar41._24_4_ = auVar13._24_4_ * fVar199;
      auVar41._28_4_ = auVar11._28_4_;
      auVar42._4_4_ = auVar12._4_4_ * fVar344;
      auVar42._0_4_ = auVar12._0_4_ * fVar334;
      auVar42._8_4_ = auVar12._8_4_ * fVar346;
      auVar42._12_4_ = auVar12._12_4_ * fVar348;
      auVar42._16_4_ = auVar12._16_4_ * fVar196;
      auVar42._20_4_ = auVar12._20_4_ * fVar198;
      auVar42._24_4_ = auVar12._24_4_ * fVar208;
      auVar42._28_4_ = fVar210;
      auVar9 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar178._4_4_ * fVar173;
      auVar43._0_4_ = auVar178._0_4_ * fVar115;
      auVar43._8_4_ = auVar178._8_4_ * fVar174;
      auVar43._12_4_ = auVar178._12_4_ * fVar175;
      auVar43._16_4_ = auVar178._16_4_ * fVar176;
      auVar43._20_4_ = auVar178._20_4_ * fVar197;
      auVar43._24_4_ = auVar178._24_4_ * fVar199;
      auVar43._28_4_ = fVar210;
      auVar44._4_4_ = auVar14._4_4_ * fVar344;
      auVar44._0_4_ = auVar14._0_4_ * fVar334;
      auVar44._8_4_ = auVar14._8_4_ * fVar346;
      auVar44._12_4_ = auVar14._12_4_ * fVar348;
      auVar44._16_4_ = auVar14._16_4_ * fVar196;
      auVar44._20_4_ = auVar14._20_4_ * fVar198;
      auVar44._24_4_ = auVar14._24_4_ * fVar208;
      auVar44._28_4_ = fVar209;
      auVar10 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar12._4_4_ * fVar173;
      auVar45._0_4_ = auVar12._0_4_ * fVar115;
      auVar45._8_4_ = auVar12._8_4_ * fVar174;
      auVar45._12_4_ = auVar12._12_4_ * fVar175;
      auVar45._16_4_ = auVar12._16_4_ * fVar176;
      auVar45._20_4_ = auVar12._20_4_ * fVar197;
      auVar45._24_4_ = auVar12._24_4_ * fVar199;
      auVar45._28_4_ = fVar209;
      auVar46._4_4_ = auVar178._4_4_ * fVar344;
      auVar46._0_4_ = auVar178._0_4_ * fVar334;
      auVar46._8_4_ = auVar178._8_4_ * fVar346;
      auVar46._12_4_ = auVar178._12_4_ * fVar348;
      auVar46._16_4_ = auVar178._16_4_ * fVar196;
      auVar46._20_4_ = auVar178._20_4_ * fVar198;
      auVar46._24_4_ = auVar178._24_4_ * fVar208;
      auVar46._28_4_ = auVar179._28_4_;
      auVar179 = vsubps_avx(auVar45,auVar46);
      auVar95._4_4_ = fStack_d4;
      auVar95._0_4_ = fStack_d8;
      auVar95._8_4_ = local_d0;
      auVar95._12_4_ = fStack_cc;
      auVar191._16_16_ = auVar95;
      auVar191._0_16_ = auVar95;
      auVar11 = vpermilps_avx(auVar191,0xff);
      auVar178 = vpermilps_avx(auVar191,0xaa);
      auVar13 = vpermilps_avx(auVar191,0);
      fVar196 = auVar296._0_4_ * auVar13._0_4_;
      fVar197 = auVar296._4_4_ * auVar13._4_4_;
      auVar47._4_4_ = fVar197;
      auVar47._0_4_ = fVar196;
      fVar198 = auVar296._8_4_ * auVar13._8_4_;
      auVar47._8_4_ = fVar198;
      fVar199 = auVar296._12_4_ * auVar13._12_4_;
      auVar47._12_4_ = fVar199;
      fVar208 = auVar296._16_4_ * auVar13._16_4_;
      auVar47._16_4_ = fVar208;
      fVar209 = auVar296._20_4_ * auVar13._20_4_;
      auVar47._20_4_ = fVar209;
      fVar334 = auVar12._28_4_;
      fVar210 = auVar296._24_4_ * auVar13._24_4_;
      auVar47._24_4_ = fVar210;
      auVar47._28_4_ = fVar334;
      auVar280._0_4_ = auVar221._0_4_ * auVar178._0_4_;
      auVar280._4_4_ = auVar221._4_4_ * auVar178._4_4_;
      auVar280._8_4_ = auVar221._8_4_ * auVar178._8_4_;
      auVar280._12_4_ = auVar221._12_4_ * auVar178._12_4_;
      auVar280._16_4_ = auVar221._16_4_ * auVar178._16_4_;
      auVar280._20_4_ = auVar221._20_4_ * auVar178._20_4_;
      auVar280._24_4_ = auVar221._24_4_ * auVar178._24_4_;
      auVar280._28_36_ = auVar286;
      auVar307._0_4_ = fVar196 + auVar280._0_4_;
      auVar307._4_4_ = fVar197 + auVar280._4_4_;
      auVar307._8_4_ = fVar198 + auVar280._8_4_;
      auVar307._12_4_ = fVar199 + auVar280._12_4_;
      auVar307._16_4_ = fVar208 + auVar280._16_4_;
      auVar307._20_4_ = fVar209 + auVar280._20_4_;
      auVar307._24_4_ = fVar210 + auVar280._24_4_;
      fVar115 = auVar286._0_4_;
      auVar307._28_4_ = fVar334 + fVar115;
      auVar296 = vsubps_avx(auVar47,auVar280._0_32_);
      fVar173 = auVar221._0_4_ * auVar11._0_4_;
      fVar344 = auVar221._4_4_ * auVar11._4_4_;
      auVar48._4_4_ = fVar344;
      auVar48._0_4_ = fVar173;
      fVar174 = auVar221._8_4_ * auVar11._8_4_;
      auVar48._8_4_ = fVar174;
      fVar346 = auVar221._12_4_ * auVar11._12_4_;
      auVar48._12_4_ = fVar346;
      fVar175 = auVar221._16_4_ * auVar11._16_4_;
      auVar48._16_4_ = fVar175;
      fVar348 = auVar221._20_4_ * auVar11._20_4_;
      auVar48._20_4_ = fVar348;
      fVar176 = auVar221._24_4_ * auVar11._24_4_;
      auVar48._24_4_ = fVar176;
      auVar48._28_4_ = fVar115;
      auVar321._0_4_ = fVar196 + fVar173;
      auVar321._4_4_ = fVar197 + fVar344;
      auVar321._8_4_ = fVar198 + fVar174;
      auVar321._12_4_ = fVar199 + fVar346;
      auVar321._16_4_ = fVar208 + fVar175;
      auVar321._20_4_ = fVar209 + fVar348;
      auVar321._24_4_ = fVar210 + fVar176;
      auVar321._28_4_ = fVar334 + fVar115;
      auVar221 = vsubps_avx(auVar47,auVar48);
      auVar11 = vsubps_avx(auVar307,auVar362);
      auVar12 = vsubps_avx(auVar321,auVar9);
      auVar178 = vsubps_avx(auVar221,auVar10);
      auVar13 = vsubps_avx(auVar296,auVar179);
      *(float *)(undefined1 *)local_108._buffer = auVar307._0_4_ + auVar362._0_4_;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar307._4_4_ + auVar362._4_4_;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar307._8_4_ + auVar362._8_4_;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar307._12_4_ + auVar362._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) =
           auVar307._16_4_ + auVar362._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar307._20_4_ + auVar362._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar307._24_4_ + auVar362._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar307._28_4_ + auVar362._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) =
           auVar321._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar321._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar321._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar321._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) =
           auVar321._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar321._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar321._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar321._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) =
           auVar221._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar221._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar221._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar221._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) =
           auVar221._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar221._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar221._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar221._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) =
           auVar296._0_4_ + auVar179._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar296._4_4_ + auVar179._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar296._8_4_ + auVar179._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar296._12_4_ + auVar179._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) =
           auVar296._16_4_ + auVar179._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar296._20_4_ + auVar179._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar296._24_4_ + auVar179._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar296._28_4_ + auVar179._28_4_;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar178;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar11;
      in_ZMM7 = ZEXT1664(auVar11._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"3x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; auVar286 = in_ZMM7._28_36_, uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x18) {
          auVar170._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar170._8_56_ = extraout_var_20;
          in_ZMM0._4_60_ = auVar170._4_60_;
          in_ZMM0._0_4_ = (float)auVar170._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar381._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar381._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar395._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar395._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar381,auVar395);
      auVar9 = vunpckhpd_avx(auVar381,auVar395);
      auVar296 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar179 = vunpcklpd_avx(auVar296,auVar9);
      auVar9 = vunpckhpd_avx(auVar296,auVar9);
      auVar363._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x60);
      auVar363._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x40);
      auVar369._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x70);
      auVar369._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x50);
      auVar296 = vunpcklpd_avx(auVar363,auVar369);
      auVar10 = vunpckhpd_avx(auVar363,auVar369);
      auVar221 = vunpcklps_avx(auVar296,auVar10);
      auVar10 = vunpckhps_avx(auVar296,auVar10);
      auVar296 = vunpcklpd_avx(auVar221,auVar10);
      auVar10 = vunpckhpd_avx(auVar221,auVar10);
      auVar221 = vpermilps_avx(auVar179,0);
      auVar11 = vpermilps_avx(auVar179,0x55);
      auVar12 = vpermilps_avx(auVar179,0xaa);
      auVar179 = vpermilps_avx(auVar179,0xff);
      auVar135._0_4_ =
           local_e0 * auVar221._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar179._0_4_;
      auVar135._4_4_ =
           fStack_dc * auVar221._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar179._4_4_;
      auVar135._8_4_ =
           fStack_d8 * auVar221._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar179._8_4_;
      auVar135._12_4_ =
           fStack_d4 * auVar221._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar179._12_4_;
      auVar135._16_4_ =
           local_e0 * auVar221._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar179._16_4_;
      auVar135._20_4_ =
           fStack_dc * auVar221._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar179._20_4_;
      auVar135._24_4_ =
           fStack_d8 * auVar221._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar179._24_4_;
      auVar135._28_4_ = auVar221._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar179._28_4_;
      auVar179 = vpermilps_avx(auVar296,0);
      auVar221 = vpermilps_avx(auVar296,0x55);
      auVar11 = vpermilps_avx(auVar296,0xaa);
      auVar296 = vpermilps_avx(auVar296,0xff);
      auVar192._0_4_ =
           local_e0 * auVar179._0_4_ + local_d0 * auVar221._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar296._0_4_;
      auVar192._4_4_ =
           fStack_dc * auVar179._4_4_ + fStack_cc * auVar221._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar296._4_4_;
      auVar192._8_4_ =
           fStack_d8 * auVar179._8_4_ + fStack_c8 * auVar221._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar296._8_4_;
      auVar192._12_4_ =
           fStack_d4 * auVar179._12_4_ + fStack_c4 * auVar221._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar296._12_4_;
      auVar192._16_4_ =
           local_e0 * auVar179._16_4_ + local_d0 * auVar221._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar296._16_4_;
      auVar192._20_4_ =
           fStack_dc * auVar179._20_4_ + fStack_cc * auVar221._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar296._20_4_;
      auVar192._24_4_ =
           fStack_d8 * auVar179._24_4_ + fStack_c8 * auVar221._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar296._24_4_;
      auVar192._28_4_ = auVar179._28_4_ + auVar221._28_4_ + auVar11._28_4_ + auVar296._28_4_;
      auVar103._4_4_ = fStack_9c;
      auVar103._0_4_ = local_a0;
      auVar103._8_4_ = fStack_98;
      auVar103._12_4_ = fStack_94;
      auVar308._16_16_ = auVar103;
      auVar308._0_16_ = auVar103;
      auVar179 = vpermilps_avx(auVar9,0);
      auVar296 = vpermilps_avx(auVar9,0x55);
      auVar221 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar234._0_4_ =
           local_a0 * auVar179._0_4_ + local_90 * auVar296._0_4_ +
           local_80 * auVar221._0_4_ + local_70 * auVar9._0_4_;
      auVar234._4_4_ =
           fStack_9c * auVar179._4_4_ + fStack_8c * auVar296._4_4_ +
           fStack_7c * auVar221._4_4_ + fStack_6c * auVar9._4_4_;
      auVar234._8_4_ =
           fStack_98 * auVar179._8_4_ + fStack_88 * auVar296._8_4_ +
           fStack_78 * auVar221._8_4_ + fStack_68 * auVar9._8_4_;
      auVar234._12_4_ =
           fStack_94 * auVar179._12_4_ + fStack_84 * auVar296._12_4_ +
           fStack_74 * auVar221._12_4_ + fStack_64 * auVar9._12_4_;
      auVar234._16_4_ =
           local_a0 * auVar179._16_4_ + local_90 * auVar296._16_4_ +
           local_80 * auVar221._16_4_ + local_70 * auVar9._16_4_;
      auVar234._20_4_ =
           fStack_9c * auVar179._20_4_ + fStack_8c * auVar296._20_4_ +
           fStack_7c * auVar221._20_4_ + fStack_6c * auVar9._20_4_;
      auVar234._24_4_ =
           fStack_98 * auVar179._24_4_ + fStack_88 * auVar296._24_4_ +
           fStack_78 * auVar221._24_4_ + fStack_68 * auVar9._24_4_;
      auVar234._28_4_ = auVar179._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar179 = vpermilps_avx(auVar10,0x55);
      auVar296 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar176 = auVar10._28_4_;
      fVar386 = auVar296._28_4_ + fVar176;
      auVar254._0_4_ =
           local_a0 * auVar9._0_4_ + local_90 * auVar179._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar10._0_4_;
      auVar254._4_4_ =
           fStack_9c * auVar9._4_4_ + fStack_8c * auVar179._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar10._4_4_;
      auVar254._8_4_ =
           fStack_98 * auVar9._8_4_ + fStack_88 * auVar179._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar10._8_4_;
      auVar254._12_4_ =
           fStack_94 * auVar9._12_4_ + fStack_84 * auVar179._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar10._12_4_;
      auVar254._16_4_ =
           local_a0 * auVar9._16_4_ + local_90 * auVar179._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar10._16_4_;
      auVar254._20_4_ =
           fStack_9c * auVar9._20_4_ + fStack_8c * auVar179._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar10._20_4_;
      auVar254._24_4_ =
           fStack_98 * auVar9._24_4_ + fStack_88 * auVar179._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar10._24_4_;
      auVar254._28_4_ = auVar9._28_4_ + auVar179._28_4_ + fVar386;
      auVar9 = vsubps_avx(auVar135,auVar234);
      auVar136._0_4_ = auVar135._0_4_ + auVar234._0_4_;
      auVar136._4_4_ = auVar135._4_4_ + auVar234._4_4_;
      auVar136._8_4_ = auVar135._8_4_ + auVar234._8_4_;
      auVar136._12_4_ = auVar135._12_4_ + auVar234._12_4_;
      auVar136._16_4_ = auVar135._16_4_ + auVar234._16_4_;
      auVar136._20_4_ = auVar135._20_4_ + auVar234._20_4_;
      auVar136._24_4_ = auVar135._24_4_ + auVar234._24_4_;
      auVar136._28_4_ = auVar135._28_4_ + auVar234._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar192,auVar254);
      auVar193._0_4_ = auVar192._0_4_ + auVar254._0_4_;
      auVar193._4_4_ = auVar192._4_4_ + auVar254._4_4_;
      auVar193._8_4_ = auVar192._8_4_ + auVar254._8_4_;
      auVar193._12_4_ = auVar192._12_4_ + auVar254._12_4_;
      auVar193._16_4_ = auVar192._16_4_ + auVar254._16_4_;
      auVar193._20_4_ = auVar192._20_4_ + auVar254._20_4_;
      auVar193._24_4_ = auVar192._24_4_ + auVar254._24_4_;
      auVar193._28_4_ = auVar192._28_4_ + auVar254._28_4_;
      auVar178 = vpermilps_avx(auVar9,0x1b);
      auVar10 = vperm2f128_avx(auVar178,auVar193,2);
      auVar9 = vperm2f128_avx(auVar12,auVar136,0x13);
      auVar179 = vperm2f128_avx(auVar12,auVar136,2);
      auVar296 = vpermilps_avx(auVar308,0xff);
      auVar221 = vpermilps_avx(auVar308,0xaa);
      auVar11 = vpermilps_avx(auVar308,0x55);
      auVar13 = vpermilps_avx(auVar308,0);
      fVar334 = auVar9._0_4_;
      fVar240 = auVar13._0_4_ * fVar334;
      fVar173 = auVar9._4_4_;
      fVar255 = auVar13._4_4_ * fVar173;
      auVar49._4_4_ = fVar255;
      auVar49._0_4_ = fVar240;
      fVar344 = auVar9._8_4_;
      fVar256 = auVar13._8_4_ * fVar344;
      auVar49._8_4_ = fVar256;
      fVar174 = auVar9._12_4_;
      fVar257 = auVar13._12_4_ * fVar174;
      auVar49._12_4_ = fVar257;
      fVar346 = auVar9._16_4_;
      fVar258 = auVar13._16_4_ * fVar346;
      auVar49._16_4_ = fVar258;
      fVar175 = auVar9._20_4_;
      fVar263 = auVar13._20_4_ * fVar175;
      auVar49._20_4_ = fVar263;
      fVar348 = auVar9._24_4_;
      fVar264 = auVar13._24_4_ * fVar348;
      auVar49._24_4_ = fVar264;
      auVar49._28_4_ = auVar12._28_4_;
      fVar265 = auVar11._0_4_ * fVar334;
      fVar266 = auVar11._4_4_ * fVar173;
      auVar50._4_4_ = fVar266;
      auVar50._0_4_ = fVar265;
      fVar282 = auVar11._8_4_ * fVar344;
      auVar50._8_4_ = fVar282;
      fVar283 = auVar11._12_4_ * fVar174;
      auVar50._12_4_ = fVar283;
      fVar284 = auVar11._16_4_ * fVar346;
      auVar50._16_4_ = fVar284;
      fVar287 = auVar11._20_4_ * fVar175;
      auVar50._20_4_ = fVar287;
      fVar311 = auVar11._24_4_ * fVar348;
      auVar50._24_4_ = fVar311;
      auVar50._28_4_ = auVar178._28_4_;
      fVar312 = auVar221._0_4_ * fVar334;
      fVar313 = auVar221._4_4_ * fVar173;
      auVar51._4_4_ = fVar313;
      auVar51._0_4_ = fVar312;
      fVar314 = auVar221._8_4_ * fVar344;
      auVar51._8_4_ = fVar314;
      fVar323 = auVar221._12_4_ * fVar174;
      auVar51._12_4_ = fVar323;
      fVar324 = auVar221._16_4_ * fVar346;
      auVar51._16_4_ = fVar324;
      fVar325 = auVar221._20_4_ * fVar175;
      auVar51._20_4_ = fVar325;
      fVar384 = auVar221._24_4_ * fVar348;
      auVar51._24_4_ = fVar384;
      auVar51._28_4_ = fVar386;
      fVar334 = auVar296._0_4_ * fVar334;
      fVar173 = auVar296._4_4_ * fVar173;
      auVar52._4_4_ = fVar173;
      auVar52._0_4_ = fVar334;
      fVar344 = auVar296._8_4_ * fVar344;
      auVar52._8_4_ = fVar344;
      fVar174 = auVar296._12_4_ * fVar174;
      auVar52._12_4_ = fVar174;
      fVar346 = auVar296._16_4_ * fVar346;
      auVar52._16_4_ = fVar346;
      fVar175 = auVar296._20_4_ * fVar175;
      auVar52._20_4_ = fVar175;
      fVar348 = auVar296._24_4_ * fVar348;
      auVar52._24_4_ = fVar348;
      auVar52._28_4_ = fVar176;
      auVar96._4_4_ = fStack_d4;
      auVar96._0_4_ = fStack_d8;
      auVar96._8_4_ = local_d0;
      auVar96._12_4_ = fStack_cc;
      auVar194._16_16_ = auVar96;
      auVar194._0_16_ = auVar96;
      auVar221 = vpermilps_avx(auVar194,0xff);
      auVar9 = vpermilps_avx(auVar194,0xaa);
      auVar11 = vpermilps_avx(auVar194,0);
      fVar225 = auVar179._0_4_ * auVar11._0_4_;
      fVar226 = auVar179._4_4_ * auVar11._4_4_;
      auVar53._4_4_ = fVar226;
      auVar53._0_4_ = fVar225;
      fVar227 = auVar179._8_4_ * auVar11._8_4_;
      auVar53._8_4_ = fVar227;
      fVar228 = auVar179._12_4_ * auVar11._12_4_;
      auVar53._12_4_ = fVar228;
      fVar237 = auVar179._16_4_ * auVar11._16_4_;
      auVar53._16_4_ = fVar237;
      fVar238 = auVar179._20_4_ * auVar11._20_4_;
      auVar53._20_4_ = fVar238;
      fVar196 = auVar296._28_4_;
      fVar239 = auVar179._24_4_ * auVar11._24_4_;
      auVar53._24_4_ = fVar239;
      auVar53._28_4_ = fVar196;
      auVar281._0_4_ = auVar10._0_4_ * auVar9._0_4_;
      auVar281._4_4_ = auVar10._4_4_ * auVar9._4_4_;
      auVar281._8_4_ = auVar10._8_4_ * auVar9._8_4_;
      auVar281._12_4_ = auVar10._12_4_ * auVar9._12_4_;
      auVar281._16_4_ = auVar10._16_4_ * auVar9._16_4_;
      auVar281._20_4_ = auVar10._20_4_ * auVar9._20_4_;
      auVar281._24_4_ = auVar10._24_4_ * auVar9._24_4_;
      auVar281._28_36_ = auVar286;
      auVar309._0_4_ = fVar225 + auVar281._0_4_;
      auVar309._4_4_ = fVar226 + auVar281._4_4_;
      auVar309._8_4_ = fVar227 + auVar281._8_4_;
      auVar309._12_4_ = fVar228 + auVar281._12_4_;
      auVar309._16_4_ = fVar237 + auVar281._16_4_;
      auVar309._20_4_ = fVar238 + auVar281._20_4_;
      auVar309._24_4_ = fVar239 + auVar281._24_4_;
      fVar115 = auVar286._0_4_;
      auVar309._28_4_ = fVar196 + fVar115;
      auVar9 = vsubps_avx(auVar53,auVar281._0_32_);
      fVar197 = auVar10._0_4_ * auVar221._0_4_;
      fVar198 = auVar10._4_4_ * auVar221._4_4_;
      auVar54._4_4_ = fVar198;
      auVar54._0_4_ = fVar197;
      fVar199 = auVar10._8_4_ * auVar221._8_4_;
      auVar54._8_4_ = fVar199;
      fVar208 = auVar10._12_4_ * auVar221._12_4_;
      auVar54._12_4_ = fVar208;
      fVar209 = auVar10._16_4_ * auVar221._16_4_;
      auVar54._16_4_ = fVar209;
      fVar210 = auVar10._20_4_ * auVar221._20_4_;
      auVar54._20_4_ = fVar210;
      fVar211 = auVar10._24_4_ * auVar221._24_4_;
      auVar54._24_4_ = fVar211;
      auVar54._28_4_ = fVar115;
      auVar322._0_4_ = fVar225 + fVar197;
      auVar322._4_4_ = fVar226 + fVar198;
      auVar322._8_4_ = fVar227 + fVar199;
      auVar322._12_4_ = fVar228 + fVar208;
      auVar322._16_4_ = fVar237 + fVar209;
      auVar322._20_4_ = fVar238 + fVar210;
      auVar322._24_4_ = fVar239 + fVar211;
      auVar322._28_4_ = fVar196 + fVar115;
      auVar10 = vsubps_avx(auVar53,auVar54);
      auVar179 = vsubps_avx(auVar309,auVar49);
      auVar296 = vsubps_avx(auVar322,auVar50);
      auVar221 = vsubps_avx(auVar10,auVar51);
      auVar11 = vsubps_avx(auVar9,auVar52);
      *(float *)(undefined1 *)local_108._buffer = auVar309._0_4_ + fVar240;
      *(float *)((undefined1 *)local_108._buffer + 4) = auVar309._4_4_ + fVar255;
      *(float *)((undefined1 *)local_108._buffer + 8) = auVar309._8_4_ + fVar256;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = auVar309._12_4_ + fVar257;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = auVar309._16_4_ + fVar258;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) =
           auVar309._20_4_ + fVar263;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) =
           auVar309._24_4_ + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           auVar309._28_4_ + auVar12._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = auVar322._0_4_ + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) =
           auVar322._4_4_ + fVar266;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) =
           auVar322._8_4_ + fVar282;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) =
           auVar322._12_4_ + fVar283;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = auVar322._16_4_ + fVar284;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) =
           auVar322._20_4_ + fVar287;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) =
           auVar322._24_4_ + fVar311;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) =
           auVar322._28_4_ + auVar178._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = auVar10._0_4_ + fVar312;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) =
           auVar10._4_4_ + fVar313;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) =
           auVar10._8_4_ + fVar314;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) =
           auVar10._12_4_ + fVar323;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = auVar10._16_4_ + fVar324;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) =
           auVar10._20_4_ + fVar325;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) =
           auVar10._24_4_ + fVar384;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) =
           auVar10._28_4_ + fVar386;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = auVar9._0_4_ + fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) =
           auVar9._4_4_ + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) =
           auVar9._8_4_ + fVar344;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) =
           auVar9._12_4_ + fVar174;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = auVar9._16_4_ + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) =
           auVar9._20_4_ + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) =
           auVar9._24_4_ + fVar348;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) =
           auVar9._28_4_ + fVar176;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar11;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar221;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar296;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar179;
      in_ZMM7 = ZEXT1664(auVar179._0_16_);
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"2x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 0x10) {
          auVar171._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar171._8_56_ = extraout_var_21;
          in_ZMM0._4_60_ = auVar171._4_60_;
          in_ZMM0._0_4_ = (float)auVar171._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar382._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar382._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar396._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar396._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar382,auVar396);
      auVar9 = vunpckhpd_avx(auVar382,auVar396);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar179 = vpermilps_avx(auVar10,0);
      auVar296 = vpermilps_avx(auVar10,0x55);
      auVar221 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar137._0_4_ =
           local_e0 * auVar179._0_4_ + local_d0 * auVar296._0_4_ +
           local_c0 * auVar221._0_4_ + local_b0 * auVar10._0_4_;
      auVar137._4_4_ =
           fStack_dc * auVar179._4_4_ + fStack_cc * auVar296._4_4_ +
           fStack_bc * auVar221._4_4_ + fStack_ac * auVar10._4_4_;
      auVar137._8_4_ =
           fStack_d8 * auVar179._8_4_ + fStack_c8 * auVar296._8_4_ +
           fStack_b8 * auVar221._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar137._12_4_ =
           fStack_d4 * auVar179._12_4_ + fStack_c4 * auVar296._12_4_ +
           fStack_b4 * auVar221._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar137._16_4_ =
           local_e0 * auVar179._16_4_ + local_d0 * auVar296._16_4_ +
           local_c0 * auVar221._16_4_ + local_b0 * auVar10._16_4_;
      auVar137._20_4_ =
           fStack_dc * auVar179._20_4_ + fStack_cc * auVar296._20_4_ +
           fStack_bc * auVar221._20_4_ + fStack_ac * auVar10._20_4_;
      auVar137._24_4_ =
           fStack_d8 * auVar179._24_4_ + fStack_c8 * auVar296._24_4_ +
           fStack_b8 * auVar221._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar137._28_4_ = auVar179._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar10._28_4_;
      auVar104._4_4_ = fStack_9c;
      auVar104._0_4_ = local_a0;
      auVar104._8_4_ = fStack_98;
      auVar104._12_4_ = fStack_94;
      auVar310._16_16_ = auVar104;
      auVar310._0_16_ = auVar104;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar179 = vpermilps_avx(auVar9,0x55);
      auVar296 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      fVar348 = auVar179._28_4_;
      fVar176 = auVar9._28_4_;
      fVar312 = auVar296._28_4_ + fVar176;
      auVar235._0_4_ =
           local_a0 * auVar10._0_4_ + local_90 * auVar179._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar9._0_4_;
      auVar235._4_4_ =
           fStack_9c * auVar10._4_4_ + fStack_8c * auVar179._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar9._4_4_;
      auVar235._8_4_ =
           fStack_98 * auVar10._8_4_ + fStack_88 * auVar179._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar9._8_4_;
      auVar235._12_4_ =
           fStack_94 * auVar10._12_4_ + fStack_84 * auVar179._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar9._12_4_;
      auVar235._16_4_ =
           local_a0 * auVar10._16_4_ + local_90 * auVar179._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar9._16_4_;
      auVar235._20_4_ =
           fStack_9c * auVar10._20_4_ + fStack_8c * auVar179._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar9._20_4_;
      auVar235._24_4_ =
           fStack_98 * auVar10._24_4_ + fStack_88 * auVar179._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar9._24_4_;
      auVar235._28_4_ = auVar10._28_4_ + fVar348 + fVar312;
      auVar9 = vsubps_avx(auVar137,auVar235);
      auVar138._0_4_ = auVar137._0_4_ + auVar235._0_4_;
      auVar138._4_4_ = auVar137._4_4_ + auVar235._4_4_;
      auVar138._8_4_ = auVar137._8_4_ + auVar235._8_4_;
      auVar138._12_4_ = auVar137._12_4_ + auVar235._12_4_;
      auVar138._16_4_ = auVar137._16_4_ + auVar235._16_4_;
      auVar138._20_4_ = auVar137._20_4_ + auVar235._20_4_;
      auVar138._24_4_ = auVar137._24_4_ + auVar235._24_4_;
      auVar138._28_4_ = auVar137._28_4_ + auVar235._28_4_;
      auVar221 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar221,auVar138,0x13);
      auVar10 = vperm2f128_avx(auVar221,auVar138,2);
      auVar179 = vpermilps_avx(auVar310,0xff);
      auVar296 = vpermilps_avx(auVar310,0xaa);
      auVar11 = vpermilps_avx(auVar310,0x55);
      auVar12 = vpermilps_avx(auVar310,0);
      fVar115 = auVar9._0_4_;
      fVar225 = auVar12._0_4_ * fVar115;
      fVar334 = auVar9._4_4_;
      fVar226 = auVar12._4_4_ * fVar334;
      auVar55._4_4_ = fVar226;
      auVar55._0_4_ = fVar225;
      fVar173 = auVar9._8_4_;
      fVar227 = auVar12._8_4_ * fVar173;
      auVar55._8_4_ = fVar227;
      fVar344 = auVar9._12_4_;
      fVar228 = auVar12._12_4_ * fVar344;
      auVar55._12_4_ = fVar228;
      fVar174 = auVar9._16_4_;
      fVar237 = auVar12._16_4_ * fVar174;
      auVar55._16_4_ = fVar237;
      fVar346 = auVar9._20_4_;
      fVar238 = auVar12._20_4_ * fVar346;
      auVar55._20_4_ = fVar238;
      fVar175 = auVar9._24_4_;
      fVar239 = auVar12._24_4_ * fVar175;
      auVar55._24_4_ = fVar239;
      auVar55._28_4_ = auVar221._28_4_;
      fVar240 = auVar11._0_4_ * fVar115;
      fVar255 = auVar11._4_4_ * fVar334;
      auVar56._4_4_ = fVar255;
      auVar56._0_4_ = fVar240;
      fVar256 = auVar11._8_4_ * fVar173;
      auVar56._8_4_ = fVar256;
      fVar257 = auVar11._12_4_ * fVar344;
      auVar56._12_4_ = fVar257;
      fVar258 = auVar11._16_4_ * fVar174;
      auVar56._16_4_ = fVar258;
      fVar263 = auVar11._20_4_ * fVar346;
      auVar56._20_4_ = fVar263;
      fVar264 = auVar11._24_4_ * fVar175;
      auVar56._24_4_ = fVar264;
      auVar56._28_4_ = fVar348;
      fVar265 = auVar296._0_4_ * fVar115;
      fVar266 = auVar296._4_4_ * fVar334;
      auVar57._4_4_ = fVar266;
      auVar57._0_4_ = fVar265;
      fVar282 = auVar296._8_4_ * fVar173;
      auVar57._8_4_ = fVar282;
      fVar283 = auVar296._12_4_ * fVar344;
      auVar57._12_4_ = fVar283;
      fVar284 = auVar296._16_4_ * fVar174;
      auVar57._16_4_ = fVar284;
      fVar287 = auVar296._20_4_ * fVar346;
      auVar57._20_4_ = fVar287;
      fVar311 = auVar296._24_4_ * fVar175;
      auVar57._24_4_ = fVar311;
      auVar57._28_4_ = fVar312;
      fVar115 = auVar179._0_4_ * fVar115;
      fVar334 = auVar179._4_4_ * fVar334;
      auVar58._4_4_ = fVar334;
      auVar58._0_4_ = fVar115;
      fVar173 = auVar179._8_4_ * fVar173;
      auVar58._8_4_ = fVar173;
      fVar344 = auVar179._12_4_ * fVar344;
      auVar58._12_4_ = fVar344;
      fVar174 = auVar179._16_4_ * fVar174;
      auVar58._16_4_ = fVar174;
      fVar346 = auVar179._20_4_ * fVar346;
      auVar58._20_4_ = fVar346;
      fVar175 = auVar179._24_4_ * fVar175;
      auVar58._24_4_ = fVar175;
      auVar58._28_4_ = fVar176;
      auVar97._4_4_ = fStack_d4;
      auVar97._0_4_ = fStack_d8;
      auVar97._8_4_ = local_d0;
      auVar97._12_4_ = fStack_cc;
      auVar195._16_16_ = auVar97;
      auVar195._0_16_ = auVar97;
      vpermilps_avx(auVar195,0xff);
      vpermilps_avx(auVar195,0xaa);
      auVar9 = vpermilps_avx(auVar195,0);
      fVar197 = auVar10._0_4_ * auVar9._0_4_;
      fVar198 = auVar10._4_4_ * auVar9._4_4_;
      auVar59._4_4_ = fVar198;
      auVar59._0_4_ = fVar197;
      fVar199 = auVar10._8_4_ * auVar9._8_4_;
      auVar59._8_4_ = fVar199;
      fVar208 = auVar10._12_4_ * auVar9._12_4_;
      auVar59._12_4_ = fVar208;
      fVar209 = auVar10._16_4_ * auVar9._16_4_;
      auVar59._16_4_ = fVar209;
      fVar210 = auVar10._20_4_ * auVar9._20_4_;
      auVar59._20_4_ = fVar210;
      fVar196 = auVar179._28_4_;
      fVar211 = auVar10._24_4_ * auVar9._24_4_;
      auVar59._24_4_ = fVar211;
      auVar59._28_4_ = fVar196;
      auVar9 = vsubps_avx(auVar59,auVar55);
      auVar10 = vsubps_avx(auVar59,auVar56);
      auVar179 = vsubps_avx(auVar59,auVar57);
      auVar296 = vsubps_avx(auVar59,auVar58);
      *(float *)(undefined1 *)local_108._buffer = fVar197 + fVar225;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar198 + fVar226;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar199 + fVar227;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar208 + fVar228;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar209 + fVar237;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar210 + fVar238;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar211 + fVar239;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) =
           fVar196 + auVar221._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar197 + fVar240;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar198 + fVar255;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar199 + fVar256;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar208 + fVar257;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar209 + fVar258;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar210 + fVar263;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar211 + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = fVar196 + fVar348;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar197 + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar198 + fVar266;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar199 + fVar282;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar208 + fVar283;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar209 + fVar284;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar210 + fVar287;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar211 + fVar311;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = fVar196 + fVar312;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar197 + fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar198 + fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar199 + fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar208 + fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar209 + fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar210 + fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar211 + fVar175;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = fVar196 + fVar176;
      *(undefined1 (*) [32])((long)local_108._buffer + 0x80) = auVar296;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xa0) = auVar179;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xc0) = auVar10;
      *(undefined1 (*) [32])((long)local_108._buffer + 0xe0) = auVar9;
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
    poVar106 = std::operator<<((ostream *)&std::cout,"         ");
    poVar106 = std::operator<<(poVar106,"1x8");
    std::endl<char,std::char_traits<char>>(poVar106);
    for (iVar111 = 0; iVar111 != 1000000; iVar111 = iVar111 + 1) {
      for (uVar113 = 0; uVar113 != 0x40; uVar113 = uVar113 + 1) {
        in_ZMM0._0_16_ = ZEXT816(0);
        if (uVar113 < 8) {
          auVar172._0_8_ = (double)Imath_2_5::erand48(local_e6);
          auVar172._8_56_ = extraout_var_22;
          in_ZMM0._4_60_ = auVar172._4_60_;
          in_ZMM0._0_4_ = (float)auVar172._0_8_;
        }
        *(float *)((undefined1 *)local_108._buffer + uVar113 * 4) = in_ZMM0._0_4_;
        local_f8._buffer[uVar113] = in_ZMM0._0_4_;
      }
      Imf_2_5::anon_unknown_3::dctInverse8x8_scalar<0>(local_f8._buffer);
      puVar109 = &DAT_001e6f60;
      pfVar110 = &local_e0;
      for (lVar112 = 0x10; lVar112 != 0; lVar112 = lVar112 + -1) {
        *(undefined8 *)pfVar110 = *puVar109;
        puVar109 = puVar109 + (ulong)bVar114 * -2 + 1;
        pfVar110 = pfVar110 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar383._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x20);
      auVar383._0_16_ = *(undefined1 (*) [16])local_108._buffer;
      auVar397._16_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x30);
      auVar397._0_16_ = *(undefined1 (*) [16])((long)local_108._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar383,auVar397);
      auVar9 = vunpckhpd_avx(auVar383,auVar397);
      auVar179 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar179,auVar9);
      auVar9 = vunpckhpd_avx(auVar179,auVar9);
      auVar179 = vpermilps_avx(auVar10,0);
      auVar296 = vpermilps_avx(auVar10,0x55);
      auVar221 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar139._0_4_ =
           local_e0 * auVar179._0_4_ + local_d0 * auVar296._0_4_ +
           local_c0 * auVar221._0_4_ + local_b0 * auVar10._0_4_;
      auVar139._4_4_ =
           fStack_dc * auVar179._4_4_ + fStack_cc * auVar296._4_4_ +
           fStack_bc * auVar221._4_4_ + fStack_ac * auVar10._4_4_;
      auVar139._8_4_ =
           fStack_d8 * auVar179._8_4_ + fStack_c8 * auVar296._8_4_ +
           fStack_b8 * auVar221._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar139._12_4_ =
           fStack_d4 * auVar179._12_4_ + fStack_c4 * auVar296._12_4_ +
           fStack_b4 * auVar221._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar139._16_4_ =
           local_e0 * auVar179._16_4_ + local_d0 * auVar296._16_4_ +
           local_c0 * auVar221._16_4_ + local_b0 * auVar10._16_4_;
      auVar139._20_4_ =
           fStack_dc * auVar179._20_4_ + fStack_cc * auVar296._20_4_ +
           fStack_bc * auVar221._20_4_ + fStack_ac * auVar10._20_4_;
      auVar139._24_4_ =
           fStack_d8 * auVar179._24_4_ + fStack_c8 * auVar296._24_4_ +
           fStack_b8 * auVar221._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar139._28_4_ = auVar179._28_4_ + auVar296._28_4_ + auVar221._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar179 = vpermilps_avx(auVar9,0x55);
      auVar296 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar236._0_4_ =
           local_a0 * auVar10._0_4_ + local_90 * auVar179._0_4_ +
           local_80 * auVar296._0_4_ + local_70 * auVar9._0_4_;
      auVar236._4_4_ =
           fStack_9c * auVar10._4_4_ + fStack_8c * auVar179._4_4_ +
           fStack_7c * auVar296._4_4_ + fStack_6c * auVar9._4_4_;
      auVar236._8_4_ =
           fStack_98 * auVar10._8_4_ + fStack_88 * auVar179._8_4_ +
           fStack_78 * auVar296._8_4_ + fStack_68 * auVar9._8_4_;
      auVar236._12_4_ =
           fStack_94 * auVar10._12_4_ + fStack_84 * auVar179._12_4_ +
           fStack_74 * auVar296._12_4_ + fStack_64 * auVar9._12_4_;
      auVar236._16_4_ =
           local_a0 * auVar10._16_4_ + local_90 * auVar179._16_4_ +
           local_80 * auVar296._16_4_ + local_70 * auVar9._16_4_;
      auVar236._20_4_ =
           fStack_9c * auVar10._20_4_ + fStack_8c * auVar179._20_4_ +
           fStack_7c * auVar296._20_4_ + fStack_6c * auVar9._20_4_;
      auVar236._24_4_ =
           fStack_98 * auVar10._24_4_ + fStack_88 * auVar179._24_4_ +
           fStack_78 * auVar296._24_4_ + fStack_68 * auVar9._24_4_;
      auVar236._28_4_ = auVar10._28_4_ + auVar179._28_4_ + auVar296._28_4_ + auVar9._28_4_;
      auVar9 = vsubps_avx(auVar139,auVar236);
      auVar140._0_4_ = auVar139._0_4_ + auVar236._0_4_;
      auVar140._4_4_ = auVar139._4_4_ + auVar236._4_4_;
      auVar140._8_4_ = auVar139._8_4_ + auVar236._8_4_;
      auVar140._12_4_ = auVar139._12_4_ + auVar236._12_4_;
      auVar140._16_4_ = auVar139._16_4_ + auVar236._16_4_;
      auVar140._20_4_ = auVar139._20_4_ + auVar236._20_4_;
      auVar140._24_4_ = auVar139._24_4_ + auVar236._24_4_;
      auVar140._28_4_ = auVar139._28_4_ + auVar236._28_4_;
      auVar9 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar9,auVar140,2);
      fVar115 = auVar9._0_4_ * local_e0;
      fVar334 = auVar9._4_4_ * fStack_dc;
      fVar173 = auVar9._8_4_ * fStack_d8;
      fVar344 = auVar9._12_4_ * fStack_d4;
      fVar174 = auVar9._16_4_ * local_e0;
      fVar346 = auVar9._20_4_ * fStack_dc;
      uVar60 = auVar9._28_4_;
      fVar175 = auVar9._24_4_ * fStack_d8;
      *(float *)(undefined1 *)local_108._buffer = fVar115;
      *(float *)((undefined1 *)local_108._buffer + 4) = fVar334;
      *(float *)((undefined1 *)local_108._buffer + 8) = fVar173;
      *(float *)((undefined1 *)local_108._buffer + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x10) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x10) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x20) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x20) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x30) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x30) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x40) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x40) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x50) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x50) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x60) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x60) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x70) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x70) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x80) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x80) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0x90) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0x90) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xa0) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xb0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xc0) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xd0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) = fVar115;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 4) = fVar334;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 8) = fVar173;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xe0) + 0xc) = fVar344;
      *(float *)*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) = fVar174;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 4) = fVar346;
      *(float *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 8) = fVar175;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_108._buffer + 0xf0) + 0xc) = uVar60;
      in_ZMM0 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_f8,&local_108,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
    }
  }
  Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(&local_108);
  Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(&local_f8);
  return;
}

Assistant:

void
testDct()
{
    const int            numIter = 1000000;
    Rand48               rand48(0);
    SimdAlignedBuffer64f orig;
    SimdAlignedBuffer64f test;
   
    cout << "   DCT Round Trip " << endl;
    for (int iter=0; iter<numIter; ++iter) 
    {
        for (int i=0; i<64; ++i) 
        {
            orig._buffer[i] = test._buffer[i] = rand48.nextf();
        }

        dctForward8x8(test._buffer);
        dctInverse8x8_scalar<0>(test._buffer);

        compareBufferRelative(orig, test, .02, 1e-3);
    } 

    cout << "      Inverse, DC Only" << endl;
    for (int iter=0; iter<numIter; ++iter) 
    {
        orig._buffer[0] = test._buffer[0] = rand48.nextf();
        for (int i=1; i<64; ++i) 
        {
            orig._buffer[i] = test._buffer[i] = 0;
        }

        dctInverse8x8_scalar<0>(orig._buffer);
        dctInverse8x8DcOnly(test._buffer);

        compareBufferRelative(orig, test, .01, 1e-6);
    } 


#define INVERSE_DCT_SCALAR_TEST_N(_func, _n, _desc)                \
    cout << "         " << _desc << endl;                          \
    for (int iter=0; iter<numIter; ++iter)                         \
    {                                                              \
        for (int i=0; i<64; ++i)                                   \
        {                                                          \
            if (i < 8*(8-_n))                                      \
            {                                                      \
               orig._buffer[i] = test._buffer[i] = rand48.nextf(); \
            } else {                                               \
               orig._buffer[i] = test._buffer[i] = 0;              \
            }                                                      \
        }                                                          \
        dctInverse8x8_scalar<0>(orig._buffer);                     \
        _func<_n>(test._buffer);                                   \
        compareBufferRelative(orig, test, .01, 1e-6);              \
    }

    cout << "      Inverse, Scalar: " << endl;
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 0, "8x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 1, "7x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 2, "6x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 3, "5x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 4, "4x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 5, "3x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 6, "2x8")
    INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_scalar, 7, "1x8")

    CpuId cpuid;
    if (cpuid.sse2) 
    {
        cout << "      Inverse, SSE2: " << endl;
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_sse2, 7, "1x8")
    }

    if (cpuid.avx) 
    {
        cout << "      Inverse, AVX: " << endl;
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N(dctInverse8x8_avx, 7, "1x8")
    }
}